

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  GridSOA *pGVar4;
  GridSOA *pGVar5;
  GridSOA *pGVar6;
  float *pfVar7;
  GridSOA *pGVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 uVar18;
  GridSOA *pGVar19;
  Geometry *pGVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  GridSOA *pGVar44;
  size_t sVar45;
  RTCRayN *pRVar46;
  int iVar47;
  undefined4 uVar48;
  ulong uVar49;
  RTCIntersectArguments *pRVar50;
  int iVar51;
  uint uVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  GridSOA *pGVar56;
  GridSOA *pGVar57;
  ulong uVar58;
  GridSOA *pGVar59;
  GridSOA *pGVar60;
  ulong uVar61;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar62;
  undefined4 uVar63;
  ulong unaff_R13;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar93;
  float fVar95;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar90;
  undefined1 auVar91 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar92;
  float fVar99;
  float fVar119;
  float fVar121;
  undefined1 auVar100 [16];
  float fVar122;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar120;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar123;
  float fVar129;
  float fVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar126;
  float fVar131;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  float fVar133;
  uint uVar134;
  float fVar147;
  float fVar150;
  undefined1 auVar135 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar136;
  float fVar148;
  uint uVar149;
  float fVar151;
  uint uVar152;
  float fVar153;
  float fVar154;
  uint uVar155;
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar156 [12];
  undefined1 auVar157 [12];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar166;
  undefined1 auVar167 [12];
  undefined1 auVar168 [12];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar208;
  float fVar209;
  float fVar212;
  float fVar213;
  float fVar216;
  float fVar217;
  undefined1 auVar206 [16];
  float fVar210;
  float fVar211;
  float fVar214;
  float fVar215;
  float fVar218;
  float fVar219;
  undefined1 auVar207 [16];
  float fVar220;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar221 [16];
  float fVar225;
  float fVar226;
  float fVar230;
  float fVar232;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [16];
  int iStack_1330;
  undefined8 local_12e8;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  float local_1288;
  float fStack_1284;
  vbool<4> valid;
  undefined8 local_1248;
  undefined8 uStack_1240;
  Precalculations *local_1238;
  GridSOA *local_1230;
  ulong local_1228;
  ulong local_1220;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1198 [4];
  float local_1188 [4];
  float local_1178 [4];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 *local_1120;
  undefined1 local_1118 [8];
  undefined8 uStack_1110;
  undefined1 local_1108 [8];
  float fStack_1100;
  float fStack_10fc;
  ulong local_10f0;
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar138 [16];
  undefined1 auVar143 [16];
  
  pSVar62 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar64 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar120 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar66 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar96 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_10f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar54 = local_10f0 ^ 0x10;
  iVar51 = (tray->tnear).field_0.i[k];
  auVar77._4_4_ = iVar51;
  auVar77._0_4_ = iVar51;
  auVar77._8_4_ = iVar51;
  auVar77._12_4_ = iVar51;
  iVar51 = (tray->tfar).field_0.i[k];
  auVar172._4_4_ = iVar51;
  auVar172._0_4_ = iVar51;
  auVar172._8_4_ = iVar51;
  auVar172._12_4_ = iVar51;
  local_1120 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1088 = fVar64;
  fStack_1084 = fVar64;
  fStack_1080 = fVar64;
  fStack_107c = fVar64;
  local_1098 = fVar120;
  fStack_1094 = fVar120;
  fStack_1090 = fVar120;
  fStack_108c = fVar120;
  local_10a8 = fVar66;
  fStack_10a4 = fVar66;
  fStack_10a0 = fVar66;
  fStack_109c = fVar66;
  local_10b8 = fVar94;
  fStack_10b4 = fVar94;
  fStack_10b0 = fVar94;
  fStack_10ac = fVar94;
  local_10c8 = fVar96;
  fStack_10c4 = fVar96;
  fStack_10c0 = fVar96;
  fStack_10bc = fVar96;
  local_10d8 = fVar98;
  fStack_10d4 = fVar98;
  fStack_10d0 = fVar98;
  fStack_10cc = fVar98;
  local_10e8 = auVar77;
  fVar133 = fVar64;
  fVar148 = fVar64;
  fVar151 = fVar64;
  fVar154 = fVar120;
  fVar179 = fVar120;
  fVar180 = fVar120;
  fVar181 = fVar66;
  fVar132 = fVar66;
  fVar182 = fVar66;
  fVar147 = fVar96;
  fVar183 = fVar96;
  fVar150 = fVar96;
  fVar185 = fVar94;
  fVar153 = fVar94;
  fVar192 = fVar94;
  fVar195 = fVar98;
  fVar184 = fVar98;
  fVar197 = fVar98;
  local_1238 = pre;
  while (pSVar62 != stack) {
    pSVar40 = pSVar62 + -1;
    pSVar62 = pSVar62 + -1;
    if ((float)pSVar40->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar40->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar43 = (pSVar62->ptr).ptr;
      do {
        if ((uVar43 & 8) == 0) {
          uVar49 = uVar43 & 0xfffffffffffffff0;
          fVar190 = *(float *)(ray + k * 4 + 0x70);
          pfVar9 = (float *)(uVar49 + 0x80 + uVar55);
          pfVar7 = (float *)(uVar49 + 0x20 + uVar55);
          auVar124._0_4_ = ((*pfVar9 * fVar190 + *pfVar7) - fVar64) * fVar94;
          auVar124._4_4_ = ((pfVar9[1] * fVar190 + pfVar7[1]) - fVar133) * fVar185;
          auVar124._8_4_ = ((pfVar9[2] * fVar190 + pfVar7[2]) - fVar148) * fVar153;
          auVar124._12_4_ = ((pfVar9[3] * fVar190 + pfVar7[3]) - fVar151) * fVar192;
          pfVar9 = (float *)(uVar49 + 0x80 + uVar61);
          pfVar7 = (float *)(uVar49 + 0x20 + uVar61);
          auVar124 = maxps(auVar77,auVar124);
          auVar175._0_4_ = ((*pfVar9 * fVar190 + *pfVar7) - fVar120) * fVar96;
          auVar175._4_4_ = ((pfVar9[1] * fVar190 + pfVar7[1]) - fVar154) * fVar147;
          auVar175._8_4_ = ((pfVar9[2] * fVar190 + pfVar7[2]) - fVar179) * fVar183;
          auVar175._12_4_ = ((pfVar9[3] * fVar190 + pfVar7[3]) - fVar180) * fVar150;
          pfVar9 = (float *)(uVar49 + 0x80 + local_10f0);
          pfVar7 = (float *)(uVar49 + 0x20 + local_10f0);
          auVar158._0_4_ = ((*pfVar9 * fVar190 + *pfVar7) - fVar66) * fVar98;
          auVar158._4_4_ = ((pfVar9[1] * fVar190 + pfVar7[1]) - fVar181) * fVar195;
          auVar158._8_4_ = ((pfVar9[2] * fVar190 + pfVar7[2]) - fVar132) * fVar184;
          auVar158._12_4_ = ((pfVar9[3] * fVar190 + pfVar7[3]) - fVar182) * fVar197;
          auVar158 = maxps(auVar175,auVar158);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar124,auVar158);
          pfVar9 = (float *)(uVar49 + 0x80 + (uVar55 ^ 0x10));
          pfVar7 = (float *)(uVar49 + 0x20 + (uVar55 ^ 0x10));
          auVar178._0_4_ = ((*pfVar9 * fVar190 + *pfVar7) - fVar64) * fVar94;
          auVar178._4_4_ = ((pfVar9[1] * fVar190 + pfVar7[1]) - fVar133) * fVar185;
          auVar178._8_4_ = ((pfVar9[2] * fVar190 + pfVar7[2]) - fVar148) * fVar153;
          auVar178._12_4_ = ((pfVar9[3] * fVar190 + pfVar7[3]) - fVar151) * fVar192;
          auVar124 = minps(auVar172,auVar178);
          pfVar10 = (float *)(uVar49 + 0x80 + (uVar61 ^ 0x10));
          pfVar7 = (float *)(uVar49 + 0x20 + (uVar61 ^ 0x10));
          pfVar11 = (float *)(uVar49 + 0x80 + uVar54);
          pfVar9 = (float *)(uVar49 + 0x20 + uVar54);
          auVar170._0_4_ = ((*pfVar10 * fVar190 + *pfVar7) - fVar120) * fVar96;
          auVar170._4_4_ = ((pfVar10[1] * fVar190 + pfVar7[1]) - fVar154) * fVar147;
          auVar170._8_4_ = ((pfVar10[2] * fVar190 + pfVar7[2]) - fVar179) * fVar183;
          auVar170._12_4_ = ((pfVar10[3] * fVar190 + pfVar7[3]) - fVar180) * fVar150;
          auVar164._0_4_ = ((*pfVar11 * fVar190 + *pfVar9) - fVar66) * fVar98;
          auVar164._4_4_ = ((pfVar11[1] * fVar190 + pfVar9[1]) - fVar181) * fVar195;
          auVar164._8_4_ = ((pfVar11[2] * fVar190 + pfVar9[2]) - fVar132) * fVar184;
          auVar164._12_4_ = ((pfVar11[3] * fVar190 + pfVar9[3]) - fVar182) * fVar197;
          auVar158 = minps(auVar170,auVar164);
          auVar124 = minps(auVar124,auVar158);
          if (((uint)uVar43 & 7) == 6) {
            bVar21 = (fVar190 < *(float *)(uVar49 + 0xf0) && *(float *)(uVar49 + 0xe0) <= fVar190)
                     && tNear.field_0._0_4_ <= auVar124._0_4_;
            bVar22 = (fVar190 < *(float *)(uVar49 + 0xf4) && *(float *)(uVar49 + 0xe4) <= fVar190)
                     && tNear.field_0._4_4_ <= auVar124._4_4_;
            bVar23 = (fVar190 < *(float *)(uVar49 + 0xf8) && *(float *)(uVar49 + 0xe8) <= fVar190)
                     && tNear.field_0._8_4_ <= auVar124._8_4_;
            bVar24 = (fVar190 < *(float *)(uVar49 + 0xfc) && *(float *)(uVar49 + 0xec) <= fVar190)
                     && tNear.field_0._12_4_ <= auVar124._12_4_;
          }
          else {
            bVar21 = tNear.field_0._0_4_ <= auVar124._0_4_;
            bVar22 = tNear.field_0._4_4_ <= auVar124._4_4_;
            bVar23 = tNear.field_0._8_4_ <= auVar124._8_4_;
            bVar24 = tNear.field_0._12_4_ <= auVar124._12_4_;
          }
          auVar67._0_4_ = (uint)bVar21 * -0x80000000;
          auVar67._4_4_ = (uint)bVar22 * -0x80000000;
          auVar67._8_4_ = (uint)bVar23 * -0x80000000;
          auVar67._12_4_ = (uint)bVar24 * -0x80000000;
          uVar63 = movmskps((int)unaff_R13,auVar67);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar63);
        }
        if ((uVar43 & 8) == 0) {
          if (unaff_R13 == 0) {
            iStack_1330 = 4;
          }
          else {
            uVar49 = uVar43 & 0xfffffffffffffff0;
            lVar53 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            iStack_1330 = 0;
            uVar43 = *(ulong *)(uVar49 + lVar53 * 8);
            uVar58 = unaff_R13 - 1 & unaff_R13;
            if (uVar58 != 0) {
              uVar52 = tNear.field_0.i[lVar53];
              lVar53 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
              uVar17 = *(ulong *)(uVar49 + lVar53 * 8);
              uVar15 = tNear.field_0.i[lVar53];
              uVar58 = uVar58 - 1 & uVar58;
              if (uVar58 == 0) {
                if (uVar52 < uVar15) {
                  (pSVar62->ptr).ptr = uVar17;
                  pSVar62->dist = uVar15;
                  pSVar62 = pSVar62 + 1;
                }
                else {
                  (pSVar62->ptr).ptr = uVar43;
                  pSVar62->dist = uVar52;
                  uVar43 = uVar17;
                  pSVar62 = pSVar62 + 1;
                }
              }
              else {
                auVar125._8_4_ = uVar52;
                auVar125._0_8_ = uVar43;
                auVar125._12_4_ = 0;
                auVar159._8_4_ = uVar15;
                auVar159._0_8_ = uVar17;
                auVar159._12_4_ = 0;
                lVar53 = 0;
                if (uVar58 != 0) {
                  for (; (uVar58 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                  }
                }
                uVar18 = *(undefined8 *)(uVar49 + lVar53 * 8);
                iVar51 = tNear.field_0.i[lVar53];
                auVar135._8_4_ = iVar51;
                auVar135._0_8_ = uVar18;
                auVar135._12_4_ = 0;
                auVar68._8_4_ = -(uint)((int)uVar52 < (int)uVar15);
                uVar58 = uVar58 - 1 & uVar58;
                if (uVar58 == 0) {
                  auVar68._4_4_ = auVar68._8_4_;
                  auVar68._0_4_ = auVar68._8_4_;
                  auVar68._12_4_ = auVar68._8_4_;
                  auVar165._8_4_ = uVar15;
                  auVar165._0_8_ = uVar17;
                  auVar165._12_4_ = 0;
                  auVar175 = blendvps(auVar165,auVar125,auVar68);
                  auVar124 = blendvps(auVar125,auVar159,auVar68);
                  auVar69._8_4_ = -(uint)(auVar175._8_4_ < iVar51);
                  auVar69._4_4_ = auVar69._8_4_;
                  auVar69._0_4_ = auVar69._8_4_;
                  auVar69._12_4_ = auVar69._8_4_;
                  auVar160._8_4_ = iVar51;
                  auVar160._0_8_ = uVar18;
                  auVar160._12_4_ = 0;
                  auVar158 = blendvps(auVar160,auVar175,auVar69);
                  auVar175 = blendvps(auVar175,auVar135,auVar69);
                  auVar70._8_4_ = -(uint)(auVar124._8_4_ < auVar175._8_4_);
                  auVar70._4_4_ = auVar70._8_4_;
                  auVar70._0_4_ = auVar70._8_4_;
                  auVar70._12_4_ = auVar70._8_4_;
                  SVar136 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar175,auVar124,auVar70);
                  SVar126 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar124,auVar175,auVar70);
                  *pSVar62 = SVar126;
                  pSVar62[1] = SVar136;
                  uVar43 = auVar158._0_8_;
                  pSVar62 = pSVar62 + 2;
                }
                else {
                  lVar53 = 0;
                  if (uVar58 != 0) {
                    for (; (uVar58 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                    }
                  }
                  auVar71._4_4_ = auVar68._8_4_;
                  auVar71._0_4_ = auVar68._8_4_;
                  auVar71._8_4_ = auVar68._8_4_;
                  auVar71._12_4_ = auVar68._8_4_;
                  auVar178 = blendvps(auVar159,auVar125,auVar71);
                  auVar124 = blendvps(auVar125,auVar159,auVar71);
                  auVar169._8_4_ = tNear.field_0.i[lVar53];
                  auVar169._0_8_ = *(undefined8 *)(uVar49 + lVar53 * 8);
                  auVar169._12_4_ = 0;
                  auVar72._8_4_ = -(uint)(iVar51 < tNear.field_0.i[lVar53]);
                  auVar72._4_4_ = auVar72._8_4_;
                  auVar72._0_4_ = auVar72._8_4_;
                  auVar72._12_4_ = auVar72._8_4_;
                  auVar175 = blendvps(auVar169,auVar135,auVar72);
                  auVar158 = blendvps(auVar135,auVar169,auVar72);
                  auVar73._8_4_ = -(uint)(auVar124._8_4_ < auVar158._8_4_);
                  auVar73._4_4_ = auVar73._8_4_;
                  auVar73._0_4_ = auVar73._8_4_;
                  auVar73._12_4_ = auVar73._8_4_;
                  auVar170 = blendvps(auVar158,auVar124,auVar73);
                  SVar126 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar124,auVar158,auVar73);
                  auVar74._8_4_ = -(uint)(auVar178._8_4_ < auVar175._8_4_);
                  auVar74._4_4_ = auVar74._8_4_;
                  auVar74._0_4_ = auVar74._8_4_;
                  auVar74._12_4_ = auVar74._8_4_;
                  auVar124 = blendvps(auVar175,auVar178,auVar74);
                  auVar158 = blendvps(auVar178,auVar175,auVar74);
                  auVar75._8_4_ = -(uint)(auVar158._8_4_ < auVar170._8_4_);
                  auVar75._4_4_ = auVar75._8_4_;
                  auVar75._0_4_ = auVar75._8_4_;
                  auVar75._12_4_ = auVar75._8_4_;
                  SVar136 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar170,auVar158,auVar75);
                  SVar166 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar158,auVar170,auVar75);
                  *pSVar62 = SVar126;
                  pSVar62[1] = SVar166;
                  pSVar62[2] = SVar136;
                  uVar43 = auVar124._0_8_;
                  pSVar62 = pSVar62 + 3;
                }
              }
            }
          }
        }
        else {
          iStack_1330 = 6;
        }
      } while (iStack_1330 == 0);
      if (iStack_1330 == 6) {
        if (((uint)uVar43 & 0xf) == 8) {
          pGVar19 = (local_1238->super_Precalculations).grid;
          local_1118._4_4_ = *(float *)(ray + k * 4 + 0x70) * (float)(*(int *)(pGVar19 + 8) - 1);
          auVar100 = roundss(auVar172,ZEXT416((uint)local_1118._4_4_),9);
          fVar64 = (float)(*(int *)(pGVar19 + 8) - 1) + -1.0;
          if (fVar64 <= auVar100._0_4_) {
            auVar100._0_4_ = fVar64;
          }
          fVar64 = 0.0;
          if (0.0 <= auVar100._0_4_) {
            fVar64 = auVar100._0_4_;
          }
          uVar52 = *(uint *)(pGVar19 + 0xc);
          lVar53 = (long)(int)fVar64 * (ulong)*(uint *)(pGVar19 + 0x28) +
                   (ulong)*(uint *)(pGVar19 + 0x24);
          uVar43 = uVar43 >> 4;
          lVar41 = uVar43 * 4 + lVar53;
          pGVar8 = pGVar19 + uVar43 * 4 + lVar53 + 0x2c;
          fVar120 = *(float *)(pGVar8 + 4);
          pGVar44 = pGVar19 + (ulong)uVar52 * 4 + lVar41 + 0x2c;
          fVar66 = *(float *)(pGVar44 + 4);
          fVar94 = *(float *)(pGVar8 + 8);
          fVar96 = *(float *)(pGVar44 + 8);
          if ((ulong)uVar52 == 2) {
            fVar94 = fVar120;
            fVar96 = fVar66;
          }
          uVar49 = (ulong)*(uint *)(pGVar19 + 0x14);
          lVar42 = uVar49 * 4 + lVar41;
          pGVar59 = pGVar19 + lVar42 + 0x2c;
          fVar98 = *(float *)(pGVar19 + lVar42 + 0x30);
          pGVar1 = pGVar59 + (ulong)uVar52 * 4;
          fVar133 = *(float *)(pGVar1 + 4);
          fVar148 = *(float *)(pGVar1 + 8);
          fVar151 = *(float *)(pGVar19 + lVar42 + 0x34);
          if ((ulong)uVar52 == 2) {
            fVar148 = fVar133;
            fVar151 = fVar98;
          }
          lVar42 = uVar49 * 8 + lVar41;
          pGVar56 = pGVar19 + lVar42 + 0x2c;
          fVar154 = *(float *)(pGVar19 + lVar42 + 0x30);
          pGVar2 = pGVar56 + (ulong)uVar52 * 4;
          fVar179 = *(float *)(pGVar2 + 4);
          fVar180 = *(float *)(pGVar19 + lVar42 + 0x34);
          fVar181 = *(float *)(pGVar2 + 8);
          if ((ulong)uVar52 == 2) {
            fVar180 = fVar154;
            fVar181 = fVar179;
          }
          lVar53 = uVar43 * 4 + lVar53 + 0x2c;
          uVar43 = (ulong)(*(uint *)(pGVar19 + 0x28) & 0xfffffffc);
          pGVar3 = pGVar19 + uVar43 + lVar53;
          fVar132 = *(float *)(pGVar3 + 4);
          pGVar4 = pGVar19 + (ulong)uVar52 * 4 + uVar43 + lVar53;
          fVar182 = *(float *)(pGVar4 + 4);
          fVar147 = *(float *)(pGVar3 + 8);
          fVar183 = *(float *)(pGVar4 + 8);
          if ((ulong)uVar52 == 2) {
            fVar147 = fVar132;
            fVar183 = fVar182;
          }
          pGVar60 = pGVar59 + uVar43;
          fVar150 = *(float *)(pGVar60 + 4);
          local_1228 = (ulong)uVar52;
          pGVar5 = pGVar60 + local_1228 * 4;
          fVar185 = *(float *)(pGVar5 + 4);
          fVar153 = *(float *)(pGVar60 + 8);
          fVar192 = *(float *)(pGVar5 + 8);
          if (local_1228 == 2) {
            fVar153 = fVar150;
            fVar192 = fVar185;
          }
          local_1118._4_4_ = (float)local_1118._4_4_ - fVar64;
          pGVar57 = pGVar56 + uVar43;
          fVar64 = *(float *)(pGVar57 + 4);
          pGVar6 = pGVar57 + local_1228 * 4;
          fVar195 = *(float *)(pGVar6 + 4);
          fVar184 = *(float *)(pGVar57 + 8);
          fVar197 = *(float *)(pGVar6 + 8);
          if (local_1228 == 2) {
            fVar184 = fVar64;
            fVar197 = fVar195;
          }
          uVar15 = *(uint *)(pGVar19 + 0x10);
          local_1230 = pGVar19 + uVar49 * 0xc + lVar41 + 0x2c;
          local_1138 = 1.0 - (float)local_1118._4_4_;
          local_1118._0_4_ = local_1118._4_4_;
          uStack_1110._0_4_ = (float)local_1118._4_4_;
          uStack_1110._4_4_ = (float)local_1118._4_4_;
          fStack_1134 = local_1138;
          fStack_1130 = local_1138;
          fStack_112c = local_1138;
          local_1288 = (float)*(undefined8 *)pGVar2;
          fStack_1284 = (float)((ulong)*(undefined8 *)pGVar2 >> 0x20);
          uVar16 = *(uint *)(pGVar19 + 0x18);
          uStack_12b0._0_4_ = *(undefined4 *)(pGVar19 + 0x1c);
          fVar190 = *(float *)(ray + k * 4);
          fVar186 = *(float *)(ray + k * 4 + 0x10);
          fVar203 = *(float *)(ray + k * 4 + 0x20);
          fVar12 = *(float *)(ray + k * 4 + 0x40);
          fVar123 = (*(float *)pGVar8 * local_1138 + *(float *)pGVar3 * (float)local_1118._4_4_) -
                    fVar190;
          fVar129 = (*(float *)pGVar44 * local_1138 + *(float *)pGVar4 * (float)local_1118._4_4_) -
                    fVar190;
          fVar130 = (fVar120 * local_1138 + fVar132 * (float)local_1118._4_4_) - fVar190;
          fVar131 = (fVar66 * local_1138 + fVar182 * (float)local_1118._4_4_) - fVar190;
          fVar99 = (*(float *)pGVar59 * local_1138 + *(float *)pGVar60 * (float)local_1118._4_4_) -
                   fVar186;
          fVar119 = (*(float *)pGVar1 * local_1138 + *(float *)pGVar5 * (float)local_1118._4_4_) -
                    fVar186;
          fVar121 = (fVar98 * local_1138 + fVar150 * (float)local_1118._4_4_) - fVar186;
          fVar122 = (fVar133 * local_1138 + fVar185 * (float)local_1118._4_4_) - fVar186;
          fVar65 = (*(float *)pGVar56 * local_1138 + *(float *)pGVar57 * (float)local_1118._4_4_) -
                   fVar203;
          fVar93 = (*(float *)pGVar2 * local_1138 + *(float *)pGVar6 * (float)local_1118._4_4_) -
                   fVar203;
          fVar95 = (fVar154 * local_1138 + fVar64 * (float)local_1118._4_4_) - fVar203;
          fVar97 = (fVar179 * local_1138 + fVar195 * (float)local_1118._4_4_) - fVar203;
          fVar204 = (fVar120 * local_1138 + fVar132 * (float)local_1118._4_4_) - fVar190;
          fVar208 = (fVar120 * local_1138 + fVar132 * (float)local_1118._4_4_) - fVar190;
          fVar212 = (fVar94 * local_1138 + fVar147 * (float)local_1118._4_4_) - fVar190;
          fVar216 = (fVar94 * local_1138 + fVar147 * (float)local_1118._4_4_) - fVar190;
          fVar132 = (fVar98 * local_1138 + fVar150 * (float)local_1118._4_4_) - fVar186;
          fVar147 = (fVar98 * local_1138 + fVar150 * (float)local_1118._4_4_) - fVar186;
          fVar150 = (fVar151 * local_1138 + fVar153 * (float)local_1118._4_4_) - fVar186;
          fVar153 = (fVar151 * local_1138 + fVar153 * (float)local_1118._4_4_) - fVar186;
          fVar191 = (fVar154 * local_1138 + fVar64 * (float)local_1118._4_4_) - fVar203;
          fVar194 = (fVar154 * local_1138 + fVar64 * (float)local_1118._4_4_) - fVar203;
          fVar196 = (fVar180 * local_1138 + fVar184 * (float)local_1118._4_4_) - fVar203;
          fVar198 = (fVar180 * local_1138 + fVar184 * (float)local_1118._4_4_) - fVar203;
          fVar187 = (*(float *)pGVar44 * local_1138 + *(float *)pGVar4 * (float)local_1118._4_4_) -
                    fVar190;
          fVar188 = (fVar66 * local_1138 + fVar182 * (float)local_1118._4_4_) - fVar190;
          fVar189 = (fVar66 * local_1138 + fVar182 * (float)local_1118._4_4_) - fVar190;
          fVar190 = (fVar96 * local_1138 + fVar183 * (float)local_1118._4_4_) - fVar190;
          fVar183 = (*(float *)pGVar1 * local_1138 + *(float *)pGVar5 * (float)local_1118._4_4_) -
                    fVar186;
          fVar184 = (fVar133 * local_1138 + fVar185 * (float)local_1118._4_4_) - fVar186;
          fVar185 = (fVar133 * local_1138 + fVar185 * (float)local_1118._4_4_) - fVar186;
          fVar186 = (fVar148 * local_1138 + fVar192 * (float)local_1118._4_4_) - fVar186;
          fVar200 = (local_1288 * local_1138 + *(float *)pGVar6 * (float)local_1118._4_4_) - fVar203
          ;
          fVar201 = (fStack_1284 * local_1138 + fVar195 * (float)local_1118._4_4_) - fVar203;
          fVar202 = (fVar179 * local_1138 + fVar195 * (float)local_1118._4_4_) - fVar203;
          fVar203 = (fVar181 * local_1138 + fVar197 * (float)local_1118._4_4_) - fVar203;
          local_1108._0_4_ = fVar187 - fVar123;
          local_1108._4_4_ = fVar188 - fVar129;
          fStack_1100 = fVar189 - fVar130;
          fStack_10fc = fVar190 - fVar131;
          local_f98 = fVar183 - fVar99;
          fStack_f94 = fVar184 - fVar119;
          fStack_f90 = fVar185 - fVar121;
          fStack_f8c = fVar186 - fVar122;
          local_f88 = fVar200 - fVar65;
          fStack_f84 = fVar201 - fVar93;
          fStack_f80 = fVar202 - fVar95;
          fStack_f7c = fVar203 - fVar97;
          fVar64 = *(float *)(ray + k * 4 + 0x50);
          fVar120 = *(float *)(ray + k * 4 + 0x60);
          fVar133 = fVar123 - fVar204;
          fVar148 = fVar129 - fVar208;
          fVar151 = fVar130 - fVar212;
          fVar154 = fVar131 - fVar216;
          local_fc8 = (local_f98 * (fVar200 + fVar65) - (fVar183 + fVar99) * local_f88) * fVar12 +
                      ((fVar187 + fVar123) * local_f88 -
                      (fVar200 + fVar65) * (float)local_1108._0_4_) * fVar64 +
                      ((float)local_1108._0_4_ * (fVar183 + fVar99) -
                      (fVar187 + fVar123) * local_f98) * fVar120;
          fStack_fc4 = (fStack_f94 * (fVar201 + fVar93) - (fVar184 + fVar119) * fStack_f84) * fVar12
                       + ((fVar188 + fVar129) * fStack_f84 -
                         (fVar201 + fVar93) * (float)local_1108._4_4_) * fVar64 +
                         ((float)local_1108._4_4_ * (fVar184 + fVar119) -
                         (fVar188 + fVar129) * fStack_f94) * fVar120;
          fStack_fc0 = (fStack_f90 * (fVar202 + fVar95) - (fVar185 + fVar121) * fStack_f80) * fVar12
                       + ((fVar189 + fVar130) * fStack_f80 - (fVar202 + fVar95) * fStack_1100) *
                         fVar64 + (fStack_1100 * (fVar185 + fVar121) -
                                  (fVar189 + fVar130) * fStack_f90) * fVar120;
          fStack_fbc = (fStack_f8c * (fVar203 + fVar97) - (fVar186 + fVar122) * fStack_f7c) * fVar12
                       + ((fVar190 + fVar131) * fStack_f7c - (fVar203 + fVar97) * fStack_10fc) *
                         fVar64 + (fStack_10fc * (fVar186 + fVar122) -
                                  (fVar190 + fVar131) * fStack_f8c) * fVar120;
          fVar192 = fVar99 - fVar132;
          fVar195 = fVar119 - fVar147;
          fVar197 = fVar121 - fVar150;
          fVar199 = fVar122 - fVar153;
          local_fa8 = fVar65 - fVar191;
          fStack_fa4 = fVar93 - fVar194;
          fStack_fa0 = fVar95 - fVar196;
          fStack_f9c = fVar97 - fVar198;
          fVar66 = (fVar192 * (fVar65 + fVar191) - (fVar99 + fVar132) * local_fa8) * fVar12 +
                   ((fVar123 + fVar204) * local_fa8 - (fVar65 + fVar191) * fVar133) * fVar64 +
                   (fVar133 * (fVar99 + fVar132) - (fVar123 + fVar204) * fVar192) * fVar120;
          fVar94 = (fVar195 * (fVar93 + fVar194) - (fVar119 + fVar147) * fStack_fa4) * fVar12 +
                   ((fVar129 + fVar208) * fStack_fa4 - (fVar93 + fVar194) * fVar148) * fVar64 +
                   (fVar148 * (fVar119 + fVar147) - (fVar129 + fVar208) * fVar195) * fVar120;
          local_fe8._4_4_ = fVar94;
          local_fe8._0_4_ = fVar66;
          fVar96 = (fVar197 * (fVar95 + fVar196) - (fVar121 + fVar150) * fStack_fa0) * fVar12 +
                   ((fVar130 + fVar212) * fStack_fa0 - (fVar95 + fVar196) * fVar151) * fVar64 +
                   (fVar151 * (fVar121 + fVar150) - (fVar130 + fVar212) * fVar197) * fVar120;
          fVar98 = (fVar199 * (fVar97 + fVar198) - (fVar122 + fVar153) * fStack_f9c) * fVar12 +
                   ((fVar131 + fVar216) * fStack_f9c - (fVar97 + fVar198) * fVar154) * fVar64 +
                   (fVar154 * (fVar122 + fVar153) - (fVar131 + fVar216) * fVar199) * fVar120;
          fVar205 = fVar204 - fVar187;
          fVar209 = fVar208 - fVar188;
          fVar213 = fVar212 - fVar189;
          fVar217 = fVar216 - fVar190;
          fVar179 = fVar132 - fVar183;
          fVar180 = fVar147 - fVar184;
          fVar181 = fVar150 - fVar185;
          fVar182 = fVar153 - fVar186;
          auVar227._0_4_ = fVar191 - fVar200;
          auVar227._4_4_ = fVar194 - fVar201;
          auVar227._8_4_ = fVar196 - fVar202;
          auVar227._12_4_ = fVar198 - fVar203;
          local_fe8._8_4_ = fVar96;
          local_fe8._12_4_ = fVar98;
          auVar101._0_4_ =
               (fVar179 * (fVar200 + fVar191) - (fVar183 + fVar132) * auVar227._0_4_) * fVar12 +
               ((fVar187 + fVar204) * auVar227._0_4_ - (fVar200 + fVar191) * fVar205) * fVar64 +
               (fVar205 * (fVar183 + fVar132) - (fVar187 + fVar204) * fVar179) * fVar120;
          auVar101._4_4_ =
               (fVar180 * (fVar201 + fVar194) - (fVar184 + fVar147) * auVar227._4_4_) * fVar12 +
               ((fVar188 + fVar208) * auVar227._4_4_ - (fVar201 + fVar194) * fVar209) * fVar64 +
               (fVar209 * (fVar184 + fVar147) - (fVar188 + fVar208) * fVar180) * fVar120;
          auVar101._8_4_ =
               (fVar181 * (fVar202 + fVar196) - (fVar185 + fVar150) * auVar227._8_4_) * fVar12 +
               ((fVar189 + fVar212) * auVar227._8_4_ - (fVar202 + fVar196) * fVar213) * fVar64 +
               (fVar213 * (fVar185 + fVar150) - (fVar189 + fVar212) * fVar181) * fVar120;
          auVar101._12_4_ =
               (fVar182 * (fVar203 + fVar198) - (fVar186 + fVar153) * auVar227._12_4_) * fVar12 +
               ((fVar190 + fVar216) * auVar227._12_4_ - (fVar203 + fVar198) * fVar217) * fVar64 +
               (fVar217 * (fVar186 + fVar153) - (fVar190 + fVar216) * fVar182) * fVar120;
          local_fd8._0_4_ = local_fc8 + fVar66 + auVar101._0_4_;
          local_fd8._4_4_ = fStack_fc4 + fVar94 + auVar101._4_4_;
          local_fd8._8_4_ = fStack_fc0 + fVar96 + auVar101._8_4_;
          local_fd8._12_4_ = fStack_fbc + fVar98 + auVar101._12_4_;
          auVar76._4_4_ = fStack_fc4;
          auVar76._0_4_ = local_fc8;
          auVar76._8_4_ = fStack_fc0;
          auVar76._12_4_ = fStack_fbc;
          auVar77 = minps(auVar76,local_fe8);
          auVar77 = minps(auVar77,auVar101);
          auVar171._4_4_ = fStack_fc4;
          auVar171._0_4_ = local_fc8;
          auVar171._8_4_ = fStack_fc0;
          auVar171._12_4_ = fStack_fbc;
          auVar172 = maxps(auVar171,local_fe8);
          auVar172 = maxps(auVar172,auVar101);
          auVar173._4_4_ = -(uint)(auVar172._4_4_ <= ABS(local_fd8._4_4_) * 1.1920929e-07);
          auVar173._0_4_ = -(uint)(auVar172._0_4_ <= ABS(local_fd8._0_4_) * 1.1920929e-07);
          auVar173._8_4_ = -(uint)(auVar172._8_4_ <= ABS(local_fd8._8_4_) * 1.1920929e-07);
          auVar173._12_4_ = -(uint)(auVar172._12_4_ <= ABS(local_fd8._12_4_) * 1.1920929e-07);
          auVar78._4_4_ = -(uint)(-(ABS(local_fd8._4_4_) * 1.1920929e-07) <= auVar77._4_4_);
          auVar78._0_4_ = -(uint)(-(ABS(local_fd8._0_4_) * 1.1920929e-07) <= auVar77._0_4_);
          auVar78._8_4_ = -(uint)(-(ABS(local_fd8._8_4_) * 1.1920929e-07) <= auVar77._8_4_);
          auVar78._12_4_ = -(uint)(-(ABS(local_fd8._12_4_) * 1.1920929e-07) <= auVar77._12_4_);
          auVar173 = auVar173 | auVar78;
          iVar51 = movmskps((int)&local_1230,auVar173);
          if (iVar51 != 0) {
            local_fb8 = auVar227;
            auVar228._0_4_ = local_f98 * local_fa8 - fVar192 * local_f88;
            auVar228._4_4_ = fStack_f94 * fStack_fa4 - fVar195 * fStack_f84;
            auVar228._8_4_ = fStack_f90 * fStack_fa0 - fVar197 * fStack_f80;
            auVar228._12_4_ = fStack_f8c * fStack_f9c - fVar199 * fStack_f7c;
            auVar193._0_4_ = fVar192 * auVar227._0_4_ - fVar179 * local_fa8;
            auVar193._4_4_ = fVar195 * auVar227._4_4_ - fVar180 * fStack_fa4;
            auVar193._8_4_ = fVar197 * auVar227._8_4_ - fVar181 * fStack_fa0;
            auVar193._12_4_ = fVar199 * auVar227._12_4_ - fVar182 * fStack_f9c;
            uVar134 = (uint)DAT_01fec6c0;
            uVar149 = DAT_01fec6c0._4_4_;
            uVar152 = DAT_01fec6c0._8_4_;
            uVar155 = DAT_01fec6c0._12_4_;
            auVar79._4_4_ =
                 -(uint)((float)((uint)(fVar195 * fStack_f84) & uVar149) <
                        (float)((uint)(fVar180 * fStack_fa4) & uVar149));
            auVar79._0_4_ =
                 -(uint)((float)((uint)(fVar192 * local_f88) & uVar134) <
                        (float)((uint)(fVar179 * local_fa8) & uVar134));
            auVar79._8_4_ =
                 -(uint)((float)((uint)(fVar197 * fStack_f80) & uVar152) <
                        (float)((uint)(fVar181 * fStack_fa0) & uVar152));
            auVar79._12_4_ =
                 -(uint)((float)((uint)(fVar199 * fStack_f7c) & uVar155) <
                        (float)((uint)(fVar182 * fStack_f9c) & uVar155));
            local_1168 = blendvps(auVar193,auVar228,auVar79);
            auVar206._0_4_ = fVar205 * local_fa8 - fVar133 * auVar227._0_4_;
            auVar206._4_4_ = fVar209 * fStack_fa4 - fVar148 * auVar227._4_4_;
            auVar206._8_4_ = fVar213 * fStack_fa0 - fVar151 * auVar227._8_4_;
            auVar206._12_4_ = fVar217 * fStack_f9c - fVar154 * auVar227._12_4_;
            auVar80._4_4_ =
                 -(uint)((float)((uint)((float)local_1108._4_4_ * fStack_fa4) & uVar149) <
                        (float)((uint)(fVar148 * auVar227._4_4_) & uVar149));
            auVar80._0_4_ =
                 -(uint)((float)((uint)((float)local_1108._0_4_ * local_fa8) & uVar134) <
                        (float)((uint)(fVar133 * auVar227._0_4_) & uVar134));
            auVar80._8_4_ =
                 -(uint)((float)((uint)(fStack_1100 * fStack_fa0) & uVar152) <
                        (float)((uint)(fVar151 * auVar227._8_4_) & uVar152));
            auVar80._12_4_ =
                 -(uint)((float)((uint)(fStack_10fc * fStack_f9c) & uVar155) <
                        (float)((uint)(fVar154 * auVar227._12_4_) & uVar155));
            auVar25._4_4_ = fStack_f84 * fVar148 - (float)local_1108._4_4_ * fStack_fa4;
            auVar25._0_4_ = local_f88 * fVar133 - (float)local_1108._0_4_ * local_fa8;
            auVar25._8_4_ = fStack_f80 * fVar151 - fStack_1100 * fStack_fa0;
            auVar25._12_4_ = fStack_f7c * fVar154 - fStack_10fc * fStack_f9c;
            local_1158 = blendvps(auVar206,auVar25,auVar80);
            auVar161._0_4_ = fVar133 * fVar179 - fVar205 * fVar192;
            auVar161._4_4_ = fVar148 * fVar180 - fVar209 * fVar195;
            auVar161._8_4_ = fVar151 * fVar181 - fVar213 * fVar197;
            auVar161._12_4_ = fVar154 * fVar182 - fVar217 * fVar199;
            auVar81._4_4_ =
                 -(uint)((float)((uint)(fVar148 * fStack_f94) & uVar149) <
                        (float)((uint)(fVar209 * fVar195) & uVar149));
            auVar81._0_4_ =
                 -(uint)((float)((uint)(fVar133 * local_f98) & uVar134) <
                        (float)((uint)(fVar205 * fVar192) & uVar134));
            auVar81._8_4_ =
                 -(uint)((float)((uint)(fVar151 * fStack_f90) & uVar152) <
                        (float)((uint)(fVar213 * fVar197) & uVar152));
            auVar81._12_4_ =
                 -(uint)((float)((uint)(fVar154 * fStack_f8c) & uVar155) <
                        (float)((uint)(fVar217 * fVar199) & uVar155));
            auVar31._4_4_ = (float)local_1108._4_4_ * fVar195 - fVar148 * fStack_f94;
            auVar31._0_4_ = (float)local_1108._0_4_ * fVar192 - fVar133 * local_f98;
            auVar31._8_4_ = fStack_1100 * fVar197 - fVar151 * fStack_f90;
            auVar31._12_4_ = fStack_10fc * fVar199 - fVar154 * fStack_f8c;
            local_1148 = blendvps(auVar161,auVar31,auVar81);
            fVar179 = fVar12 * local_1168._0_4_ +
                      fVar64 * local_1158._0_4_ + fVar120 * local_1148._0_4_;
            fVar180 = fVar12 * local_1168._4_4_ +
                      fVar64 * local_1158._4_4_ + fVar120 * local_1148._4_4_;
            fVar181 = fVar12 * local_1168._8_4_ +
                      fVar64 * local_1158._8_4_ + fVar120 * local_1148._8_4_;
            fVar132 = fVar12 * local_1168._12_4_ +
                      fVar64 * local_1158._12_4_ + fVar120 * local_1148._12_4_;
            fVar179 = fVar179 + fVar179;
            fVar180 = fVar180 + fVar180;
            fVar181 = fVar181 + fVar181;
            fVar132 = fVar132 + fVar132;
            auVar102._0_4_ = fVar65 * local_1148._0_4_;
            auVar102._4_4_ = fVar93 * local_1148._4_4_;
            auVar102._8_4_ = fVar95 * local_1148._8_4_;
            auVar102._12_4_ = fVar97 * local_1148._12_4_;
            fVar133 = fVar123 * local_1168._0_4_ + fVar99 * local_1158._0_4_ + auVar102._0_4_;
            fVar148 = fVar129 * local_1168._4_4_ + fVar119 * local_1158._4_4_ + auVar102._4_4_;
            fVar182 = fVar130 * local_1168._8_4_ + fVar121 * local_1158._8_4_ + auVar102._8_4_;
            fVar147 = fVar131 * local_1168._12_4_ + fVar122 * local_1158._12_4_ + auVar102._12_4_;
            auVar27._4_4_ = fVar180;
            auVar27._0_4_ = fVar179;
            auVar27._8_4_ = fVar181;
            auVar27._12_4_ = fVar132;
            auVar77 = rcpps(auVar102,auVar27);
            fVar64 = auVar77._0_4_;
            fVar120 = auVar77._4_4_;
            fVar151 = auVar77._8_4_;
            fVar154 = auVar77._12_4_;
            fVar133 = ((1.0 - fVar179 * fVar64) * fVar64 + fVar64) * (fVar133 + fVar133);
            fVar148 = ((1.0 - fVar180 * fVar120) * fVar120 + fVar120) * (fVar148 + fVar148);
            fVar151 = ((1.0 - fVar181 * fVar151) * fVar151 + fVar151) * (fVar182 + fVar182);
            fVar154 = ((1.0 - fVar132 * fVar154) * fVar154 + fVar154) * (fVar147 + fVar147);
            fVar64 = *(float *)(ray + k * 4 + 0x80);
            fVar120 = *(float *)(ray + k * 4 + 0x30);
            auVar103._0_4_ = -(uint)(fVar133 <= fVar64 && fVar120 <= fVar133) & auVar173._0_4_;
            auVar103._4_4_ = -(uint)(fVar148 <= fVar64 && fVar120 <= fVar148) & auVar173._4_4_;
            auVar103._8_4_ = -(uint)(fVar151 <= fVar64 && fVar120 <= fVar151) & auVar173._8_4_;
            auVar103._12_4_ = -(uint)(fVar154 <= fVar64 && fVar120 <= fVar154) & auVar173._12_4_;
            iVar51 = movmskps(iVar51,auVar103);
            if (iVar51 != 0) {
              valid.field_0.i[0] = auVar103._0_4_ & -(uint)(fVar179 != 0.0);
              valid.field_0.i[1] = auVar103._4_4_ & -(uint)(fVar180 != 0.0);
              valid.field_0.i[2] = auVar103._8_4_ & -(uint)(fVar181 != 0.0);
              valid.field_0.i[3] = auVar103._12_4_ & -(uint)(fVar132 != 0.0);
              iVar51 = movmskps(iVar51,(undefined1  [16])valid.field_0);
              if (iVar51 != 0) {
                tNear.field_0.v[1] = fStack_fc4;
                tNear.field_0.v[0] = local_fc8;
                tNear.field_0.v[3] = fStack_fbc;
                tNear.field_0.v[2] = fStack_fc0;
                local_1178[0] = fVar133;
                local_1178[1] = fVar148;
                local_1178[2] = fVar151;
                local_1178[3] = fVar154;
                pGVar20 = (context->scene->geometries).items[uVar16].ptr;
                if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar77 = rcpps(_DAT_01fec6c0,local_fd8);
                  fVar64 = auVar77._0_4_;
                  fVar120 = auVar77._4_4_;
                  fVar179 = auVar77._8_4_;
                  fVar180 = auVar77._12_4_;
                  fVar64 = (float)(-(uint)(1e-18 <= ABS(local_fd8._0_4_)) &
                                  (uint)(((float)DAT_01feca10 - local_fd8._0_4_ * fVar64) * fVar64 +
                                        fVar64));
                  fVar120 = (float)(-(uint)(1e-18 <= ABS(local_fd8._4_4_)) &
                                   (uint)((DAT_01feca10._4_4_ - local_fd8._4_4_ * fVar120) * fVar120
                                         + fVar120));
                  fVar179 = (float)(-(uint)(1e-18 <= ABS(local_fd8._8_4_)) &
                                   (uint)((DAT_01feca10._8_4_ - local_fd8._8_4_ * fVar179) * fVar179
                                         + fVar179));
                  fVar180 = (float)(-(uint)(1e-18 <= ABS(local_fd8._12_4_)) &
                                   (uint)((DAT_01feca10._12_4_ - local_fd8._12_4_ * fVar180) *
                                          fVar180 + fVar180));
                  auVar127._0_4_ = local_fc8 * fVar64;
                  auVar127._4_4_ = fStack_fc4 * fVar120;
                  auVar127._8_4_ = fStack_fc0 * fVar179;
                  auVar127._12_4_ = fStack_fbc * fVar180;
                  auVar158 = minps(auVar127,_DAT_01feca10);
                  auVar104._0_4_ = fVar64 * fVar66;
                  auVar104._4_4_ = fVar120 * fVar94;
                  auVar104._8_4_ = fVar179 * fVar96;
                  auVar104._12_4_ = fVar180 * fVar98;
                  auVar124 = minps(auVar104,_DAT_01feca10);
                  auVar77 = *(undefined1 (*) [16])local_1230;
                  auVar167 = auVar77._0_12_;
                  auVar172 = *(undefined1 (*) [16])(local_1230 + local_1228 * 4);
                  auVar156 = auVar172._0_12_;
                  if (local_1228 == 2) {
                    auVar167._0_8_ = auVar77._0_8_;
                    auVar167._8_4_ = auVar77._4_4_;
                    auVar156._0_8_ = auVar172._0_8_;
                    auVar156._8_4_ = auVar172._4_4_;
                  }
                  auVar174._4_4_ = auVar167._4_4_;
                  auVar174._8_4_ = auVar167._8_4_;
                  auVar138._0_8_ = auVar167._0_8_;
                  auVar138._8_4_ = auVar174._4_4_;
                  uVar149 = auVar156._4_4_;
                  auVar138._12_4_ = uVar149;
                  auVar137._8_8_ = auVar138._8_8_;
                  auVar137._0_4_ = auVar167._0_4_;
                  uVar134 = auVar156._0_4_;
                  auVar137._4_4_ = uVar134;
                  auVar174._0_4_ = auVar174._4_4_;
                  auVar174._12_4_ = auVar174._8_4_;
                  auVar162._0_8_ = auVar156._0_8_;
                  auVar162._8_4_ = uVar149;
                  auVar162._12_4_ = auVar156._8_4_;
                  auVar77 = pblendw(auVar137,ZEXT816(0),0xaa);
                  auVar175 = pblendw(auVar174,ZEXT816(0),0xaa);
                  auVar172 = pblendw(auVar162,ZEXT816(0),0xaa);
                  fVar96 = auVar158._0_4_;
                  fVar98 = auVar158._4_4_;
                  fVar179 = auVar158._8_4_;
                  fVar180 = auVar158._12_4_;
                  fVar64 = auVar124._0_4_;
                  fVar120 = auVar124._4_4_;
                  fVar66 = auVar124._8_4_;
                  fVar94 = auVar124._12_4_;
                  fVar181 = (1.0 - fVar96) - fVar64;
                  fVar132 = (1.0 - fVar98) - fVar120;
                  fVar182 = (1.0 - fVar179) - fVar66;
                  fVar147 = (1.0 - fVar180) - fVar94;
                  local_1198[1] =
                       (float)auVar77._4_4_ * 0.00012207031 * fVar132 +
                       (float)auVar172._4_4_ * 0.00012207031 * fVar120 +
                       (float)auVar175._4_4_ * 0.00012207031 * fVar98;
                  local_1198[0] =
                       (float)auVar77._0_4_ * 0.00012207031 * fVar181 +
                       (float)auVar172._0_4_ * 0.00012207031 * fVar64 +
                       (float)auVar175._0_4_ * 0.00012207031 * fVar96;
                  local_1198[2] =
                       (float)auVar77._8_4_ * 0.00012207031 * fVar182 +
                       (float)auVar172._8_4_ * 0.00012207031 * fVar66 +
                       (float)auVar175._8_4_ * 0.00012207031 * fVar179;
                  local_1198[3] =
                       (float)auVar77._12_4_ * 0.00012207031 * fVar147 +
                       (float)auVar172._12_4_ * 0.00012207031 * fVar94 +
                       (float)auVar175._12_4_ * 0.00012207031 * fVar180;
                  local_1188[1] =
                       fVar132 * (float)(uVar134 >> 0x10) * 0.00012207031 +
                       (float)(uVar149 >> 0x10) * 0.00012207031 * fVar120 +
                       (float)(auVar174._4_4_ >> 0x10) * 0.00012207031 * fVar98;
                  local_1188[0] =
                       fVar181 * (float)(auVar137._0_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar134 >> 0x10) * 0.00012207031 * fVar64 +
                       (float)(auVar174._4_4_ >> 0x10) * 0.00012207031 * fVar96;
                  local_1188[2] =
                       fVar182 * (float)(auVar174._4_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar149 >> 0x10) * 0.00012207031 * fVar66 +
                       (float)(auVar174._8_4_ >> 0x10) * 0.00012207031 * fVar179;
                  local_1188[3] =
                       fVar147 * (float)(uVar149 >> 0x10) * 0.00012207031 +
                       (float)(auVar156._8_4_ >> 0x10) * 0.00012207031 * fVar94 +
                       (float)(auVar174._8_4_ >> 0x10) * 0.00012207031 * fVar180;
                  auVar38._4_4_ = fVar148;
                  auVar38._0_4_ = fVar133;
                  auVar38._8_4_ = fVar151;
                  auVar38._12_4_ = fVar154;
                  auVar172 = blendvps(_DAT_01feb9f0,auVar38,(undefined1  [16])valid.field_0);
                  auVar139._4_4_ = auVar172._0_4_;
                  auVar139._0_4_ = auVar172._4_4_;
                  auVar139._8_4_ = auVar172._12_4_;
                  auVar139._12_4_ = auVar172._8_4_;
                  auVar77 = minps(auVar139,auVar172);
                  auVar105._0_8_ = auVar77._8_8_;
                  auVar105._8_4_ = auVar77._0_4_;
                  auVar105._12_4_ = auVar77._4_4_;
                  auVar77 = minps(auVar105,auVar77);
                  auVar106._0_8_ =
                       CONCAT44(-(uint)(auVar77._4_4_ == auVar172._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar77._0_4_ == auVar172._0_4_) & valid.field_0.i[0]);
                  auVar106._8_4_ = -(uint)(auVar77._8_4_ == auVar172._8_4_) & valid.field_0.i[2];
                  auVar106._12_4_ = -(uint)(auVar77._12_4_ == auVar172._12_4_) & valid.field_0.i[3];
                  iVar51 = movmskps(uVar52,auVar106);
                  aVar82 = valid.field_0;
                  if (iVar51 != 0) {
                    aVar82.i[2] = auVar106._8_4_;
                    aVar82._0_8_ = auVar106._0_8_;
                    aVar82.i[3] = auVar106._12_4_;
                  }
                  uVar134 = movmskps(iVar51,(undefined1  [16])aVar82);
                  lVar53 = 0;
                  if (uVar134 != 0) {
                    for (; (uVar134 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar64 = local_1198[lVar53];
                    fVar120 = local_1188[lVar53];
                    uVar63 = *(undefined4 *)(local_1168 + lVar53 * 4);
                    uVar48 = *(undefined4 *)(local_1158 + lVar53 * 4);
                    uVar13 = *(undefined4 *)(local_1148 + lVar53 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_1178[lVar53];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar63;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar48;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                    *(float *)(ray + k * 4 + 0xf0) = fVar64;
                    *(float *)(ray + k * 4 + 0x100) = fVar120;
                    *(undefined4 *)(ray + k * 4 + 0x110) = (undefined4)uStack_12b0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar16;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_12a8 = CONCAT44(uVar16,uVar16);
                    local_12b8 = CONCAT44((undefined4)uStack_12b0,(undefined4)uStack_12b0);
                    uStack_12b0._4_4_ = (undefined4)uStack_12b0;
                    uVar18 = *local_1120;
                    uVar33 = local_1120[1];
                    local_1220 = (ulong)uVar15;
                    do {
                      uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_1048 = local_1198[lVar53];
                      fVar64 = local_1188[lVar53];
                      *(float *)(ray + k * 4 + 0x80) = local_1178[lVar53];
                      args.context = context->user;
                      local_1038._4_4_ = fVar64;
                      local_1038._0_4_ = fVar64;
                      local_1038._8_4_ = fVar64;
                      local_1038._12_4_ = fVar64;
                      local_1078 = *(undefined4 *)(local_1168 + lVar53 * 4);
                      uVar48 = *(undefined4 *)(local_1158 + lVar53 * 4);
                      uVar13 = *(undefined4 *)(local_1148 + lVar53 * 4);
                      local_1068._4_4_ = uVar48;
                      local_1068._0_4_ = uVar48;
                      local_1068._8_4_ = uVar48;
                      local_1068._12_4_ = uVar48;
                      local_1058._4_4_ = uVar13;
                      local_1058._0_4_ = uVar13;
                      local_1058._8_4_ = uVar13;
                      local_1058._12_4_ = uVar13;
                      uStack_1074 = local_1078;
                      uStack_1070 = local_1078;
                      uStack_106c = local_1078;
                      fStack_1044 = local_1048;
                      fStack_1040 = local_1048;
                      fStack_103c = local_1048;
                      local_1028 = local_12b8;
                      uStack_1020 = uStack_12b0;
                      local_1018 = local_12a8;
                      uStack_1010 = CONCAT44(uVar16,uVar16);
                      local_1008 = (args.context)->instID[0];
                      uStack_1004 = local_1008;
                      uStack_1000 = local_1008;
                      uStack_ffc = local_1008;
                      local_ff8 = (args.context)->instPrimID[0];
                      uStack_ff4 = local_ff8;
                      uStack_ff0 = local_ff8;
                      uStack_fec = local_ff8;
                      args.valid = (int *)&local_1248;
                      pRVar50 = (RTCIntersectArguments *)pGVar20->userPtr;
                      args.hit = (RTCHitN *)&local_1078;
                      args.N = 4;
                      pRVar46 = (RTCRayN *)pGVar20->intersectionFilterN;
                      local_1248 = uVar18;
                      uStack_1240 = uVar33;
                      args.geometryUserPtr = pRVar50;
                      args.ray = (RTCRayN *)ray;
                      if (pRVar46 != (RTCRayN *)0x0) {
                        pRVar46 = (RTCRayN *)(*(code *)pRVar46)(&args);
                      }
                      auVar34._8_8_ = uStack_1240;
                      auVar34._0_8_ = local_1248;
                      if (auVar34 == (undefined1  [16])0x0) {
                        auVar113._8_4_ = 0xffffffff;
                        auVar113._0_8_ = 0xffffffffffffffff;
                        auVar113._12_4_ = 0xffffffff;
                        auVar113 = auVar113 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar50 = context->args;
                        pRVar46 = (RTCRayN *)pRVar50->filter;
                        if ((pRVar46 != (RTCRayN *)0x0) &&
                           (((pRVar50->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar46 = (RTCRayN *)(*(code *)pRVar46)(&args);
                        }
                        auVar35._8_8_ = uStack_1240;
                        auVar35._0_8_ = local_1248;
                        auVar89._0_4_ = -(uint)((int)local_1248 == 0);
                        auVar89._4_4_ = -(uint)((int)((ulong)local_1248 >> 0x20) == 0);
                        auVar89._8_4_ = -(uint)((int)uStack_1240 == 0);
                        auVar89._12_4_ = -(uint)((int)((ulong)uStack_1240 >> 0x20) == 0);
                        auVar113 = auVar89 ^ _DAT_01febe20;
                        if (auVar35 != (undefined1  [16])0x0) {
                          auVar77 = blendvps(*(undefined1 (*) [16])args.hit,
                                             *(undefined1 (*) [16])(args.ray + 0xc0),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                             *(undefined1 (*) [16])(args.ray + 0xd0),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0xd0) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                             *(undefined1 (*) [16])(args.ray + 0xe0),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                             *(undefined1 (*) [16])(args.ray + 0xf0),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                             *(undefined1 (*) [16])(args.ray + 0x100),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0x100) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                             *(undefined1 (*) [16])(args.ray + 0x110),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0x110) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                             *(undefined1 (*) [16])(args.ray + 0x120),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0x120) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                             *(undefined1 (*) [16])(args.ray + 0x130),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar77;
                          auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                             *(undefined1 (*) [16])(args.ray + 0x140),auVar89);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar77;
                          pRVar46 = args.ray;
                          pRVar50 = (RTCIntersectArguments *)args.hit;
                        }
                      }
                      if ((_DAT_01fecb20 & auVar113) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar63;
                      }
                      valid.field_0.v[lVar53] = 0.0;
                      fVar64 = *(float *)(ray + k * 4 + 0x80);
                      valid.field_0.i[0] = -(uint)(fVar133 <= fVar64) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(fVar148 <= fVar64) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(fVar151 <= fVar64) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(fVar154 <= fVar64) & valid.field_0.i[3];
                      iVar51 = movmskps((int)pRVar46,(undefined1  [16])valid.field_0);
                      if (iVar51 != 0) {
                        auVar172 = blendvps(_DAT_01feb9f0,auVar38,(undefined1  [16])valid.field_0);
                        auVar145._4_4_ = auVar172._0_4_;
                        auVar145._0_4_ = auVar172._4_4_;
                        auVar145._8_4_ = auVar172._12_4_;
                        auVar145._12_4_ = auVar172._8_4_;
                        auVar77 = minps(auVar145,auVar172);
                        auVar114._0_8_ = auVar77._8_8_;
                        auVar114._8_4_ = auVar77._0_4_;
                        auVar114._12_4_ = auVar77._4_4_;
                        auVar77 = minps(auVar114,auVar77);
                        auVar115._0_8_ =
                             CONCAT44(-(uint)(auVar77._4_4_ == auVar172._4_4_) & valid.field_0.i[1],
                                      -(uint)(auVar77._0_4_ == auVar172._0_4_) & valid.field_0.i[0])
                        ;
                        auVar115._8_4_ =
                             -(uint)(auVar77._8_4_ == auVar172._8_4_) & valid.field_0.i[2];
                        auVar115._12_4_ =
                             -(uint)(auVar77._12_4_ == auVar172._12_4_) & valid.field_0.i[3];
                        iVar47 = movmskps((int)pRVar50,auVar115);
                        aVar90 = valid.field_0;
                        if (iVar47 != 0) {
                          aVar90.i[2] = auVar115._8_4_;
                          aVar90._0_8_ = auVar115._0_8_;
                          aVar90.i[3] = auVar115._12_4_;
                        }
                        uVar63 = movmskps(iVar47,(undefined1  [16])aVar90);
                        uVar43 = CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar63);
                        lVar53 = 0;
                        if (uVar43 != 0) {
                          for (; (uVar43 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                          }
                        }
                      }
                    } while ((char)iVar51 != '\0');
                  }
                }
              }
            }
          }
          uVar43 = (ulong)uVar52;
          if (2 < uVar15) {
            lVar41 = uVar43 * 4 + lVar41;
            pGVar44 = pGVar19 + lVar41 + 0x2c;
            fVar64 = *(float *)(pGVar19 + lVar41 + 0x30);
            pGVar8 = pGVar44 + uVar43 * 4;
            fVar120 = *(float *)(pGVar8 + 4);
            fVar66 = *(float *)(pGVar19 + lVar41 + 0x34);
            fVar94 = *(float *)(pGVar8 + 8);
            if (uVar43 == 2) {
              fVar66 = fVar64;
              fVar94 = fVar120;
            }
            pGVar59 = (local_1238->super_Precalculations).grid;
            uVar49 = (ulong)*(uint *)(pGVar59 + 0x14);
            pGVar19 = pGVar44 + uVar49 * 4;
            fVar96 = *(float *)(pGVar19 + 4);
            pGVar1 = pGVar19 + uVar43 * 4;
            fVar98 = *(float *)(pGVar1 + 4);
            fVar133 = *(float *)(pGVar19 + 8);
            fVar148 = *(float *)(pGVar1 + 8);
            if (uVar43 == 2) {
              fVar133 = fVar96;
              fVar148 = fVar98;
            }
            pGVar2 = pGVar44 + uVar49 * 8;
            fVar151 = *(float *)(pGVar2 + 4);
            pGVar56 = pGVar2 + uVar43 * 4;
            fVar154 = *(float *)(pGVar56 + 4);
            fVar179 = *(float *)(pGVar2 + 8);
            fVar180 = *(float *)(pGVar56 + 8);
            if (uVar43 == 2) {
              fVar179 = fVar151;
              fVar180 = fVar154;
            }
            uVar43 = (ulong)(*(uint *)(pGVar59 + 0x28) & 0xfffffffc);
            pGVar3 = pGVar44 + uVar43;
            fVar181 = *(float *)(pGVar3 + 4);
            local_1228 = (ulong)uVar52;
            pGVar4 = pGVar44 + local_1228 * 4 + uVar43;
            fVar132 = *(float *)(pGVar4 + 4);
            fVar182 = *(float *)(pGVar3 + 8);
            fVar147 = *(float *)(pGVar4 + 8);
            if (local_1228 == 2) {
              fVar182 = fVar181;
              fVar147 = fVar132;
            }
            pGVar60 = pGVar19 + uVar43;
            fVar183 = *(float *)(pGVar60 + 4);
            pGVar5 = pGVar60 + local_1228 * 4;
            fVar150 = *(float *)(pGVar5 + 4);
            fVar185 = *(float *)(pGVar60 + 8);
            fVar153 = *(float *)(pGVar5 + 8);
            if (local_1228 == 2) {
              fVar185 = fVar183;
              fVar153 = fVar150;
            }
            pGVar57 = pGVar2 + uVar43;
            fVar192 = *(float *)(pGVar57 + 4);
            pGVar6 = pGVar57 + local_1228 * 4;
            fVar195 = *(float *)(pGVar6 + 4);
            fVar184 = *(float *)(pGVar6 + 8);
            fVar197 = *(float *)(pGVar57 + 8);
            if (local_1228 == 2) {
              fVar184 = fVar195;
              fVar197 = fVar192;
            }
            local_1230 = pGVar44 + uVar49 * 0xc;
            fVar198 = *(float *)pGVar2 * local_1138;
            fVar200 = *(float *)pGVar56 * fStack_1134;
            fVar202 = fVar151 * fStack_1130;
            fVar205 = fVar154 * fStack_112c;
            fVar97 = fVar64 * local_1138;
            fVar99 = fVar64 * fStack_1134;
            fVar119 = fVar66 * fStack_1130;
            fVar66 = fVar66 * fStack_112c;
            fVar194 = fVar96 * local_1138;
            fVar196 = fVar96 * fStack_1134;
            fVar199 = fVar133 * fStack_1130;
            fVar133 = fVar133 * fStack_112c;
            fVar93 = fVar151 * local_1138;
            fVar151 = fVar151 * fStack_1134;
            fVar95 = fVar179 * fStack_1130;
            fVar179 = fVar179 * fStack_112c;
            fVar188 = *(float *)pGVar8 * local_1138;
            fVar189 = fVar120 * fStack_1134;
            fVar191 = fVar120 * fStack_1130;
            fVar94 = fVar94 * fStack_112c;
            fVar130 = *(float *)pGVar1 * local_1138;
            fVar131 = fVar98 * fStack_1134;
            fVar187 = fVar98 * fStack_1130;
            fVar148 = fVar148 * fStack_112c;
            fVar201 = *(float *)pGVar56 * local_1138;
            fVar204 = fVar154 * fStack_1134;
            fVar154 = fVar154 * fStack_1130;
            fVar180 = fVar180 * fStack_112c;
            uVar16 = *(uint *)(pGVar59 + 0x18);
            uVar63 = *(undefined4 *)(pGVar59 + 0x1c);
            fVar190 = *(float *)(ray + k * 4);
            fVar186 = *(float *)(ray + k * 4 + 0x10);
            fVar203 = *(float *)(ray + k * 4 + 0x20);
            fVar12 = *(float *)(ray + k * 4 + 0x40);
            fVar65 = *(float *)(ray + k * 4 + 0x50);
            fVar121 = (*(float *)pGVar44 * local_1138 + *(float *)pGVar3 * (float)local_1118._0_4_)
                      - fVar190;
            fVar122 = (*(float *)pGVar8 * fStack_1134 + *(float *)pGVar4 * (float)local_1118._4_4_)
                      - fVar190;
            fVar123 = (fVar64 * fStack_1130 + fVar181 * (float)uStack_1110) - fVar190;
            fVar129 = (fVar120 * fStack_112c + fVar132 * uStack_1110._4_4_) - fVar190;
            local_1138 = (*(float *)pGVar19 * local_1138 +
                         *(float *)pGVar60 * (float)local_1118._0_4_) - fVar186;
            fStack_1134 = (*(float *)pGVar1 * fStack_1134 +
                          *(float *)pGVar5 * (float)local_1118._4_4_) - fVar186;
            fStack_1130 = (fVar96 * fStack_1130 + fVar183 * (float)uStack_1110) - fVar186;
            fStack_112c = (fVar98 * fStack_112c + fVar150 * uStack_1110._4_4_) - fVar186;
            fVar225 = (fVar198 + *(float *)pGVar57 * (float)local_1118._0_4_) - fVar203;
            fVar230 = (fVar200 + *(float *)pGVar6 * (float)local_1118._4_4_) - fVar203;
            fVar232 = (fVar202 + fVar192 * (float)uStack_1110) - fVar203;
            fVar234 = (fVar205 + fVar195 * uStack_1110._4_4_) - fVar203;
            fVar96 = (fVar97 + fVar181 * (float)local_1118._0_4_) - fVar190;
            fVar98 = (fVar99 + fVar181 * (float)local_1118._4_4_) - fVar190;
            fVar181 = (fVar119 + fVar182 * (float)uStack_1110) - fVar190;
            fVar182 = (fVar66 + fVar182 * uStack_1110._4_4_) - fVar190;
            fVar198 = (fVar194 + fVar183 * (float)local_1118._0_4_) - fVar186;
            fVar200 = (fVar196 + fVar183 * (float)local_1118._4_4_) - fVar186;
            fVar202 = (fVar199 + fVar185 * (float)uStack_1110) - fVar186;
            fVar205 = (fVar133 + fVar185 * uStack_1110._4_4_) - fVar186;
            fVar97 = (fVar93 + fVar192 * (float)local_1118._0_4_) - fVar203;
            fVar119 = (fVar151 + fVar192 * (float)local_1118._4_4_) - fVar203;
            fVar194 = (fVar95 + fVar197 * (float)uStack_1110) - fVar203;
            fVar196 = (fVar179 + fVar197 * uStack_1110._4_4_) - fVar203;
            fVar185 = (fVar188 + *(float *)pGVar4 * (float)local_1118._0_4_) - fVar190;
            fVar192 = (fVar189 + fVar132 * (float)local_1118._4_4_) - fVar190;
            fVar197 = (fVar191 + fVar132 * (float)uStack_1110) - fVar190;
            fVar190 = (fVar94 + fVar147 * uStack_1110._4_4_) - fVar190;
            fVar147 = (fVar130 + *(float *)pGVar5 * (float)local_1118._0_4_) - fVar186;
            fVar183 = (fVar131 + fVar150 * (float)local_1118._4_4_) - fVar186;
            fVar150 = (fVar187 + fVar150 * (float)uStack_1110) - fVar186;
            fVar186 = (fVar148 + fVar153 * uStack_1110._4_4_) - fVar186;
            fVar209 = (fVar201 + *(float *)pGVar6 * (float)local_1118._0_4_) - fVar203;
            fVar212 = (fVar204 + fVar195 * (float)local_1118._4_4_) - fVar203;
            fVar213 = (fVar154 + fVar195 * (float)uStack_1110) - fVar203;
            fVar203 = (fVar180 + fVar184 * uStack_1110._4_4_) - fVar203;
            fVar216 = fVar185 - fVar121;
            fVar210 = fVar192 - fVar122;
            fVar214 = fVar197 - fVar123;
            fVar218 = fVar190 - fVar129;
            fVar95 = fVar147 - local_1138;
            fVar130 = fVar183 - fStack_1134;
            fVar187 = fVar150 - fStack_1130;
            fVar189 = fVar186 - fStack_112c;
            fVar220 = fVar209 - fVar225;
            fVar222 = fVar212 - fVar230;
            fVar223 = fVar213 - fVar232;
            fVar224 = fVar203 - fVar234;
            fVar64 = *(float *)(ray + k * 4 + 0x60);
            fVar99 = fVar121 - fVar96;
            fVar131 = fVar122 - fVar98;
            fVar188 = fVar123 - fVar181;
            fVar191 = fVar129 - fVar182;
            fVar217 = local_1138 - fVar198;
            fVar211 = fStack_1134 - fVar200;
            fVar215 = fStack_1130 - fVar202;
            fVar219 = fStack_112c - fVar205;
            fVar120 = (fVar95 * (fVar209 + fVar225) - (fVar147 + local_1138) * fVar220) * fVar12 +
                      ((fVar185 + fVar121) * fVar220 - (fVar209 + fVar225) * fVar216) * fVar65 +
                      (fVar216 * (fVar147 + local_1138) - (fVar185 + fVar121) * fVar95) * fVar64;
            fVar66 = (fVar130 * (fVar212 + fVar230) - (fVar183 + fStack_1134) * fVar222) * fVar12 +
                     ((fVar192 + fVar122) * fVar222 - (fVar212 + fVar230) * fVar210) * fVar65 +
                     (fVar210 * (fVar183 + fStack_1134) - (fVar192 + fVar122) * fVar130) * fVar64;
            auVar83._0_8_ = CONCAT44(fVar66,fVar120);
            auVar83._8_4_ =
                 (fVar187 * (fVar213 + fVar232) - (fVar150 + fStack_1130) * fVar223) * fVar12 +
                 ((fVar197 + fVar123) * fVar223 - (fVar213 + fVar232) * fVar214) * fVar65 +
                 (fVar214 * (fVar150 + fStack_1130) - (fVar197 + fVar123) * fVar187) * fVar64;
            auVar83._12_4_ =
                 (fVar189 * (fVar203 + fVar234) - (fVar186 + fStack_112c) * fVar224) * fVar12 +
                 ((fVar190 + fVar129) * fVar224 - (fVar203 + fVar234) * fVar218) * fVar65 +
                 (fVar218 * (fVar186 + fStack_112c) - (fVar190 + fVar129) * fVar189) * fVar64;
            fVar94 = fVar225 - fVar97;
            fVar133 = fVar230 - fVar119;
            fVar148 = fVar232 - fVar194;
            fVar151 = fVar234 - fVar196;
            fVar153 = (fVar217 * (fVar225 + fVar97) - (local_1138 + fVar198) * fVar94) * fVar12 +
                      ((fVar121 + fVar96) * fVar94 - (fVar225 + fVar97) * fVar99) * fVar65 +
                      (fVar99 * (local_1138 + fVar198) - (fVar121 + fVar96) * fVar217) * fVar64;
            fVar195 = (fVar211 * (fVar230 + fVar119) - (fStack_1134 + fVar200) * fVar133) * fVar12 +
                      ((fVar122 + fVar98) * fVar133 - (fVar230 + fVar119) * fVar131) * fVar65 +
                      (fVar131 * (fStack_1134 + fVar200) - (fVar122 + fVar98) * fVar211) * fVar64;
            fVar184 = (fVar215 * (fVar232 + fVar194) - (fStack_1130 + fVar202) * fVar148) * fVar12 +
                      ((fVar123 + fVar181) * fVar148 - (fVar232 + fVar194) * fVar188) * fVar65 +
                      (fVar188 * (fStack_1130 + fVar202) - (fVar123 + fVar181) * fVar215) * fVar64;
            fVar93 = (fVar219 * (fVar234 + fVar196) - (fStack_112c + fVar205) * fVar151) * fVar12 +
                     ((fVar129 + fVar182) * fVar151 - (fVar234 + fVar196) * fVar191) * fVar65 +
                     (fVar191 * (fStack_112c + fVar205) - (fVar129 + fVar182) * fVar219) * fVar64;
            fVar226 = fVar96 - fVar185;
            fVar231 = fVar98 - fVar192;
            fVar233 = fVar181 - fVar197;
            fVar235 = fVar182 - fVar190;
            fVar154 = fVar198 - fVar147;
            fVar179 = fVar200 - fVar183;
            fVar180 = fVar202 - fVar150;
            fVar132 = fVar205 - fVar186;
            fVar199 = fVar97 - fVar209;
            fVar201 = fVar119 - fVar212;
            fVar204 = fVar194 - fVar213;
            fVar208 = fVar196 - fVar203;
            uStack_1110._0_4_ = auVar83._8_4_;
            local_1118 = (undefined1  [8])auVar83._0_8_;
            uStack_1110._4_4_ = auVar83._12_4_;
            auVar107._0_4_ =
                 (fVar154 * (fVar209 + fVar97) - (fVar147 + fVar198) * fVar199) * fVar12 +
                 ((fVar185 + fVar96) * fVar199 - (fVar209 + fVar97) * fVar226) * fVar65 +
                 (fVar226 * (fVar147 + fVar198) - (fVar185 + fVar96) * fVar154) * fVar64;
            auVar107._4_4_ =
                 (fVar179 * (fVar212 + fVar119) - (fVar183 + fVar200) * fVar201) * fVar12 +
                 ((fVar192 + fVar98) * fVar201 - (fVar212 + fVar119) * fVar231) * fVar65 +
                 (fVar231 * (fVar183 + fVar200) - (fVar192 + fVar98) * fVar179) * fVar64;
            auVar107._8_4_ =
                 (fVar180 * (fVar213 + fVar194) - (fVar150 + fVar202) * fVar204) * fVar12 +
                 ((fVar197 + fVar181) * fVar204 - (fVar213 + fVar194) * fVar233) * fVar65 +
                 (fVar233 * (fVar150 + fVar202) - (fVar197 + fVar181) * fVar180) * fVar64;
            auVar107._12_4_ =
                 (fVar132 * (fVar203 + fVar196) - (fVar186 + fVar205) * fVar208) * fVar12 +
                 ((fVar190 + fVar182) * fVar208 - (fVar203 + fVar196) * fVar235) * fVar65 +
                 (fVar235 * (fVar186 + fVar205) - (fVar190 + fVar182) * fVar132) * fVar64;
            local_1108._0_4_ = fVar120 + fVar153 + auVar107._0_4_;
            local_1108._4_4_ = fVar66 + fVar195 + auVar107._4_4_;
            fStack_1100 = auVar83._8_4_ + fVar184 + auVar107._8_4_;
            fStack_10fc = auVar83._12_4_ + fVar93 + auVar107._12_4_;
            auVar28._4_4_ = fVar195;
            auVar28._0_4_ = fVar153;
            auVar28._8_4_ = fVar184;
            auVar28._12_4_ = fVar93;
            auVar77 = minps(auVar83,auVar28);
            auVar172 = minps(auVar77,auVar107);
            auVar77 = _local_1118;
            auVar29._4_4_ = fVar195;
            auVar29._0_4_ = fVar153;
            auVar29._8_4_ = fVar184;
            auVar29._12_4_ = fVar93;
            auVar124 = maxps(_local_1118,auVar29);
            auVar124 = maxps(auVar124,auVar107);
            auVar176._4_4_ = -(uint)(auVar124._4_4_ <= ABS((float)local_1108._4_4_) * 1.1920929e-07)
            ;
            auVar176._0_4_ = -(uint)(auVar124._0_4_ <= ABS((float)local_1108._0_4_) * 1.1920929e-07)
            ;
            auVar176._8_4_ = -(uint)(auVar124._8_4_ <= ABS(fStack_1100) * 1.1920929e-07);
            auVar176._12_4_ = -(uint)(auVar124._12_4_ <= ABS(fStack_10fc) * 1.1920929e-07);
            auVar84._4_4_ =
                 -(uint)(-(ABS((float)local_1108._4_4_) * 1.1920929e-07) <= auVar172._4_4_);
            auVar84._0_4_ =
                 -(uint)(-(ABS((float)local_1108._0_4_) * 1.1920929e-07) <= auVar172._0_4_);
            auVar84._8_4_ = -(uint)(-(ABS(fStack_1100) * 1.1920929e-07) <= auVar172._8_4_);
            auVar84._12_4_ = -(uint)(-(ABS(fStack_10fc) * 1.1920929e-07) <= auVar172._12_4_);
            auVar176 = auVar176 | auVar84;
            iVar51 = movmskps((int)&local_1230,auVar176);
            if (iVar51 != 0) {
              auVar140._0_4_ = fVar95 * fVar94 - fVar217 * fVar220;
              auVar140._4_4_ = fVar130 * fVar133 - fVar211 * fVar222;
              auVar140._8_4_ = fVar187 * fVar148 - fVar215 * fVar223;
              auVar140._12_4_ = fVar189 * fVar151 - fVar219 * fVar224;
              auVar207._0_4_ = fVar217 * fVar199 - fVar154 * fVar94;
              auVar207._4_4_ = fVar211 * fVar201 - fVar179 * fVar133;
              auVar207._8_4_ = fVar215 * fVar204 - fVar180 * fVar148;
              auVar207._12_4_ = fVar219 * fVar208 - fVar132 * fVar151;
              auVar85._4_4_ = -(uint)(ABS(fVar211 * fVar222) < ABS(fVar179 * fVar133));
              auVar85._0_4_ = -(uint)(ABS(fVar217 * fVar220) < ABS(fVar154 * fVar94));
              auVar85._8_4_ = -(uint)(ABS(fVar215 * fVar223) < ABS(fVar180 * fVar148));
              auVar85._12_4_ = -(uint)(ABS(fVar219 * fVar224) < ABS(fVar132 * fVar151));
              local_1168 = blendvps(auVar207,auVar140,auVar85);
              auVar229._0_4_ = fVar226 * fVar94 - fVar99 * fVar199;
              auVar229._4_4_ = fVar231 * fVar133 - fVar131 * fVar201;
              auVar229._8_4_ = fVar233 * fVar148 - fVar188 * fVar204;
              auVar229._12_4_ = fVar235 * fVar151 - fVar191 * fVar208;
              auVar86._4_4_ = -(uint)(ABS(fVar210 * fVar133) < ABS(fVar131 * fVar201));
              auVar86._0_4_ = -(uint)(ABS(fVar216 * fVar94) < ABS(fVar99 * fVar199));
              auVar86._8_4_ = -(uint)(ABS(fVar214 * fVar148) < ABS(fVar188 * fVar204));
              auVar86._12_4_ = -(uint)(ABS(fVar218 * fVar151) < ABS(fVar191 * fVar208));
              auVar30._4_4_ = fVar222 * fVar131 - fVar210 * fVar133;
              auVar30._0_4_ = fVar220 * fVar99 - fVar216 * fVar94;
              auVar30._8_4_ = fVar223 * fVar188 - fVar214 * fVar148;
              auVar30._12_4_ = fVar224 * fVar191 - fVar218 * fVar151;
              local_1158 = blendvps(auVar229,auVar30,auVar86);
              auVar221._0_4_ = fVar99 * fVar154 - fVar226 * fVar217;
              auVar221._4_4_ = fVar131 * fVar179 - fVar231 * fVar211;
              auVar221._8_4_ = fVar188 * fVar180 - fVar233 * fVar215;
              auVar221._12_4_ = fVar191 * fVar132 - fVar235 * fVar219;
              auVar87._4_4_ = -(uint)(ABS(fVar131 * fVar130) < ABS(fVar231 * fVar211));
              auVar87._0_4_ = -(uint)(ABS(fVar99 * fVar95) < ABS(fVar226 * fVar217));
              auVar87._8_4_ = -(uint)(ABS(fVar188 * fVar187) < ABS(fVar233 * fVar215));
              auVar87._12_4_ = -(uint)(ABS(fVar191 * fVar189) < ABS(fVar235 * fVar219));
              auVar32._4_4_ = fVar210 * fVar211 - fVar131 * fVar130;
              auVar32._0_4_ = fVar216 * fVar217 - fVar99 * fVar95;
              auVar32._8_4_ = fVar214 * fVar215 - fVar188 * fVar187;
              auVar32._12_4_ = fVar218 * fVar219 - fVar191 * fVar189;
              local_1148 = blendvps(auVar221,auVar32,auVar87);
              fVar179 = fVar12 * local_1168._0_4_ +
                        fVar65 * local_1158._0_4_ + fVar64 * local_1148._0_4_;
              fVar180 = fVar12 * local_1168._4_4_ +
                        fVar65 * local_1158._4_4_ + fVar64 * local_1148._4_4_;
              fVar181 = fVar12 * local_1168._8_4_ +
                        fVar65 * local_1158._8_4_ + fVar64 * local_1148._8_4_;
              fVar132 = fVar12 * local_1168._12_4_ +
                        fVar65 * local_1158._12_4_ + fVar64 * local_1148._12_4_;
              fVar179 = fVar179 + fVar179;
              fVar180 = fVar180 + fVar180;
              fVar181 = fVar181 + fVar181;
              fVar132 = fVar132 + fVar132;
              auVar108._0_4_ = fVar225 * local_1148._0_4_;
              auVar108._4_4_ = fVar230 * local_1148._4_4_;
              auVar108._8_4_ = fVar232 * local_1148._8_4_;
              auVar108._12_4_ = fVar234 * local_1148._12_4_;
              fVar96 = fVar121 * local_1168._0_4_ + local_1138 * local_1158._0_4_ + auVar108._0_4_;
              fVar98 = fVar122 * local_1168._4_4_ + fStack_1134 * local_1158._4_4_ + auVar108._4_4_;
              fVar151 = fVar123 * local_1168._8_4_ + fStack_1130 * local_1158._8_4_ + auVar108._8_4_
              ;
              fVar154 = fVar129 * local_1168._12_4_ +
                        fStack_112c * local_1158._12_4_ + auVar108._12_4_;
              auVar26._4_4_ = fVar180;
              auVar26._0_4_ = fVar179;
              auVar26._8_4_ = fVar181;
              auVar26._12_4_ = fVar132;
              auVar172 = rcpps(auVar108,auVar26);
              fVar64 = auVar172._0_4_;
              fVar94 = auVar172._4_4_;
              fVar133 = auVar172._8_4_;
              fVar148 = auVar172._12_4_;
              auVar141._0_4_ = fVar96 + fVar96;
              auVar141._4_4_ = fVar98 + fVar98;
              auVar141._8_4_ = fVar151 + fVar151;
              auVar141._12_4_ = fVar154 + fVar154;
              fVar96 = ((1.0 - fVar179 * fVar64) * fVar64 + fVar64) * auVar141._0_4_;
              fVar98 = ((1.0 - fVar180 * fVar94) * fVar94 + fVar94) * auVar141._4_4_;
              fVar133 = ((1.0 - fVar181 * fVar133) * fVar133 + fVar133) * auVar141._8_4_;
              fVar148 = ((1.0 - fVar132 * fVar148) * fVar148 + fVar148) * auVar141._12_4_;
              fVar64 = *(float *)(ray + k * 4 + 0x80);
              fVar94 = *(float *)(ray + k * 4 + 0x30);
              auVar109._0_4_ = -(uint)(fVar96 <= fVar64 && fVar94 <= fVar96) & auVar176._0_4_;
              auVar109._4_4_ = -(uint)(fVar98 <= fVar64 && fVar94 <= fVar98) & auVar176._4_4_;
              auVar109._8_4_ = -(uint)(fVar133 <= fVar64 && fVar94 <= fVar133) & auVar176._8_4_;
              auVar109._12_4_ = -(uint)(fVar148 <= fVar64 && fVar94 <= fVar148) & auVar176._12_4_;
              iVar51 = movmskps(iVar51,auVar109);
              if (iVar51 != 0) {
                valid.field_0.i[0] = auVar109._0_4_ & -(uint)(fVar179 != 0.0);
                valid.field_0.i[1] = auVar109._4_4_ & -(uint)(fVar180 != 0.0);
                valid.field_0.i[2] = auVar109._8_4_ & -(uint)(fVar181 != 0.0);
                valid.field_0.i[3] = auVar109._12_4_ & -(uint)(fVar132 != 0.0);
                iVar51 = movmskps(iVar51,(undefined1  [16])valid.field_0);
                if (iVar51 != 0) {
                  tNear.field_0._8_8_ = uStack_1110;
                  tNear.field_0._0_8_ = auVar83._0_8_;
                  local_1178[0] = fVar96;
                  local_1178[1] = fVar98;
                  local_1178[2] = fVar133;
                  local_1178[3] = fVar148;
                  pGVar20 = (context->scene->geometries).items[uVar16].ptr;
                  if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar172 = rcpps(auVar141,_local_1108);
                    fVar64 = auVar172._0_4_;
                    fVar94 = auVar172._4_4_;
                    fVar151 = auVar172._8_4_;
                    fVar154 = auVar172._12_4_;
                    fVar64 = (float)(-(uint)(1e-18 <= ABS((float)local_1108._0_4_)) &
                                    (uint)(((float)DAT_01feca10 - (float)local_1108._0_4_ * fVar64)
                                           * fVar64 + fVar64));
                    fVar94 = (float)(-(uint)(1e-18 <= ABS((float)local_1108._4_4_)) &
                                    (uint)((DAT_01feca10._4_4_ - (float)local_1108._4_4_ * fVar94) *
                                           fVar94 + fVar94));
                    fVar151 = (float)(-(uint)(1e-18 <= ABS(fStack_1100)) &
                                     (uint)((DAT_01feca10._8_4_ - fStack_1100 * fVar151) * fVar151 +
                                           fVar151));
                    fVar154 = (float)(-(uint)(1e-18 <= ABS(fStack_10fc)) &
                                     (uint)((DAT_01feca10._12_4_ - fStack_10fc * fVar154) * fVar154
                                           + fVar154));
                    auVar128._0_4_ = fVar120 * fVar64;
                    auVar128._4_4_ = fVar66 * fVar94;
                    auVar128._8_4_ = auVar83._8_4_ * fVar151;
                    auVar128._12_4_ = auVar83._12_4_ * fVar154;
                    auVar175 = minps(auVar128,_DAT_01feca10);
                    auVar110._0_4_ = fVar64 * fVar153;
                    auVar110._4_4_ = fVar94 * fVar195;
                    auVar110._8_4_ = fVar151 * fVar184;
                    auVar110._12_4_ = fVar154 * fVar93;
                    auVar158 = minps(auVar110,_DAT_01feca10);
                    auVar172 = *(undefined1 (*) [16])local_1230;
                    auVar168 = auVar172._0_12_;
                    auVar124 = *(undefined1 (*) [16])(local_1230 + local_1228 * 4);
                    auVar157 = auVar124._0_12_;
                    if (local_1228 == 2) {
                      auVar168._0_8_ = auVar172._0_8_;
                      auVar168._8_4_ = auVar172._4_4_;
                      auVar157._0_8_ = auVar124._0_8_;
                      auVar157._8_4_ = auVar124._4_4_;
                    }
                    auVar177._4_4_ = auVar168._4_4_;
                    auVar177._8_4_ = auVar168._8_4_;
                    auVar143._0_8_ = auVar168._0_8_;
                    auVar143._8_4_ = auVar177._4_4_;
                    uVar149 = auVar157._4_4_;
                    auVar143._12_4_ = uVar149;
                    auVar142._8_8_ = auVar143._8_8_;
                    auVar142._0_4_ = auVar168._0_4_;
                    uVar134 = auVar157._0_4_;
                    auVar142._4_4_ = uVar134;
                    auVar177._0_4_ = auVar177._4_4_;
                    auVar177._12_4_ = auVar177._8_4_;
                    auVar163._0_8_ = auVar157._0_8_;
                    auVar163._8_4_ = uVar149;
                    auVar163._12_4_ = auVar157._8_4_;
                    auVar172 = pblendw(auVar142,ZEXT816(0),0xaa);
                    auVar178 = pblendw(auVar177,ZEXT816(0),0xaa);
                    auVar124 = pblendw(auVar163,ZEXT816(0),0xaa);
                    fVar151 = auVar175._0_4_;
                    fVar154 = auVar175._4_4_;
                    fVar179 = auVar175._8_4_;
                    fVar180 = auVar175._12_4_;
                    fVar64 = auVar158._0_4_;
                    fVar120 = auVar158._4_4_;
                    fVar66 = auVar158._8_4_;
                    fVar94 = auVar158._12_4_;
                    fVar181 = (1.0 - fVar151) - fVar64;
                    fVar132 = (1.0 - fVar154) - fVar120;
                    fVar182 = (1.0 - fVar179) - fVar66;
                    fVar147 = (1.0 - fVar180) - fVar94;
                    local_1198[1] =
                         (float)auVar172._4_4_ * 0.00012207031 * fVar132 +
                         (float)auVar124._4_4_ * 0.00012207031 * fVar120 +
                         (float)auVar178._4_4_ * 0.00012207031 * fVar154;
                    local_1198[0] =
                         (float)auVar172._0_4_ * 0.00012207031 * fVar181 +
                         (float)auVar124._0_4_ * 0.00012207031 * fVar64 +
                         (float)auVar178._0_4_ * 0.00012207031 * fVar151;
                    local_1198[2] =
                         (float)auVar172._8_4_ * 0.00012207031 * fVar182 +
                         (float)auVar124._8_4_ * 0.00012207031 * fVar66 +
                         (float)auVar178._8_4_ * 0.00012207031 * fVar179;
                    local_1198[3] =
                         (float)auVar172._12_4_ * 0.00012207031 * fVar147 +
                         (float)auVar124._12_4_ * 0.00012207031 * fVar94 +
                         (float)auVar178._12_4_ * 0.00012207031 * fVar180;
                    local_1188[1] =
                         fVar132 * (float)(uVar134 >> 0x10) * 0.00012207031 +
                         (float)(uVar149 >> 0x10) * 0.00012207031 * fVar120 +
                         (float)(auVar177._4_4_ >> 0x10) * 0.00012207031 * fVar154;
                    local_1188[0] =
                         fVar181 * (float)(auVar142._0_4_ >> 0x10) * 0.00012207031 +
                         (float)(uVar134 >> 0x10) * 0.00012207031 * fVar64 +
                         (float)(auVar177._4_4_ >> 0x10) * 0.00012207031 * fVar151;
                    local_1188[2] =
                         fVar182 * (float)(auVar177._4_4_ >> 0x10) * 0.00012207031 +
                         (float)(uVar149 >> 0x10) * 0.00012207031 * fVar66 +
                         (float)(auVar177._8_4_ >> 0x10) * 0.00012207031 * fVar179;
                    local_1188[3] =
                         fVar147 * (float)(uVar149 >> 0x10) * 0.00012207031 +
                         (float)(auVar157._8_4_ >> 0x10) * 0.00012207031 * fVar94 +
                         (float)(auVar177._8_4_ >> 0x10) * 0.00012207031 * fVar180;
                    auVar39._4_4_ = fVar98;
                    auVar39._0_4_ = fVar96;
                    auVar39._8_4_ = fVar133;
                    auVar39._12_4_ = fVar148;
                    auVar124 = blendvps(_DAT_01feb9f0,auVar39,(undefined1  [16])valid.field_0);
                    auVar144._4_4_ = auVar124._0_4_;
                    auVar144._0_4_ = auVar124._4_4_;
                    auVar144._8_4_ = auVar124._12_4_;
                    auVar144._12_4_ = auVar124._8_4_;
                    auVar172 = minps(auVar144,auVar124);
                    auVar111._0_8_ = auVar172._8_8_;
                    auVar111._8_4_ = auVar172._0_4_;
                    auVar111._12_4_ = auVar172._4_4_;
                    auVar172 = minps(auVar111,auVar172);
                    auVar112._0_8_ =
                         CONCAT44(-(uint)(auVar172._4_4_ == auVar124._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar172._0_4_ == auVar124._0_4_) & valid.field_0.i[0]);
                    auVar112._8_4_ = -(uint)(auVar172._8_4_ == auVar124._8_4_) & valid.field_0.i[2];
                    auVar112._12_4_ =
                         -(uint)(auVar172._12_4_ == auVar124._12_4_) & valid.field_0.i[3];
                    iVar51 = movmskps(uVar52,auVar112);
                    aVar88 = valid.field_0;
                    if (iVar51 != 0) {
                      aVar88.i[2] = auVar112._8_4_;
                      aVar88._0_8_ = auVar112._0_8_;
                      aVar88.i[3] = auVar112._12_4_;
                    }
                    uVar52 = movmskps(iVar51,(undefined1  [16])aVar88);
                    lVar53 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                      }
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar64 = local_1198[lVar53];
                      fVar120 = local_1188[lVar53];
                      uVar48 = *(undefined4 *)(local_1168 + lVar53 * 4);
                      uVar13 = *(undefined4 *)(local_1158 + lVar53 * 4);
                      uVar14 = *(undefined4 *)(local_1148 + lVar53 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_1178[lVar53];
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar48;
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                      *(float *)(ray + k * 4 + 0xf0) = fVar64;
                      *(float *)(ray + k * 4 + 0x100) = fVar120;
                      *(undefined4 *)(ray + k * 4 + 0x110) = uVar63;
                      *(uint *)(ray + k * 4 + 0x120) = uVar16;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_12e8 = CONCAT44(uVar16,uVar16);
                      uVar18 = *local_1120;
                      uVar33 = local_1120[1];
                      local_1220 = (ulong)uVar15;
                      _local_1118 = auVar77;
                      do {
                        uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_1048 = local_1198[lVar53];
                        fVar64 = local_1188[lVar53];
                        *(float *)(ray + k * 4 + 0x80) = local_1178[lVar53];
                        args.context = context->user;
                        local_1038._4_4_ = fVar64;
                        local_1038._0_4_ = fVar64;
                        local_1038._8_4_ = fVar64;
                        local_1038._12_4_ = fVar64;
                        local_1078 = *(undefined4 *)(local_1168 + lVar53 * 4);
                        uVar13 = *(undefined4 *)(local_1158 + lVar53 * 4);
                        uVar14 = *(undefined4 *)(local_1148 + lVar53 * 4);
                        local_1068._4_4_ = uVar13;
                        local_1068._0_4_ = uVar13;
                        local_1068._8_4_ = uVar13;
                        local_1068._12_4_ = uVar13;
                        local_1058._4_4_ = uVar14;
                        local_1058._0_4_ = uVar14;
                        local_1058._8_4_ = uVar14;
                        local_1058._12_4_ = uVar14;
                        uStack_1074 = local_1078;
                        uStack_1070 = local_1078;
                        uStack_106c = local_1078;
                        fStack_1044 = local_1048;
                        fStack_1040 = local_1048;
                        fStack_103c = local_1048;
                        local_1028 = CONCAT44(uVar63,uVar63);
                        uStack_1020 = CONCAT44(uVar63,uVar63);
                        local_1018 = local_12e8;
                        uStack_1010 = CONCAT44(uVar16,uVar16);
                        local_1008 = (args.context)->instID[0];
                        uStack_1004 = local_1008;
                        uStack_1000 = local_1008;
                        uStack_ffc = local_1008;
                        local_ff8 = (args.context)->instPrimID[0];
                        uStack_ff4 = local_ff8;
                        uStack_ff0 = local_ff8;
                        uStack_fec = local_ff8;
                        args.valid = (int *)&local_1248;
                        pRVar50 = (RTCIntersectArguments *)pGVar20->userPtr;
                        args.hit = (RTCHitN *)&local_1078;
                        args.N = 4;
                        pRVar46 = (RTCRayN *)pGVar20->intersectionFilterN;
                        local_1248 = uVar18;
                        uStack_1240 = uVar33;
                        args.geometryUserPtr = pRVar50;
                        args.ray = (RTCRayN *)ray;
                        if (pRVar46 != (RTCRayN *)0x0) {
                          pRVar46 = (RTCRayN *)(*(code *)pRVar46)(&args);
                        }
                        auVar36._8_8_ = uStack_1240;
                        auVar36._0_8_ = local_1248;
                        if (auVar36 == (undefined1  [16])0x0) {
                          auVar116._8_4_ = 0xffffffff;
                          auVar116._0_8_ = 0xffffffffffffffff;
                          auVar116._12_4_ = 0xffffffff;
                          auVar116 = auVar116 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar50 = context->args;
                          pRVar46 = (RTCRayN *)pRVar50->filter;
                          if ((pRVar46 != (RTCRayN *)0x0) &&
                             (((pRVar50->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar46 = (RTCRayN *)(*(code *)pRVar46)(&args);
                          }
                          auVar37._8_8_ = uStack_1240;
                          auVar37._0_8_ = local_1248;
                          auVar91._0_4_ = -(uint)((int)local_1248 == 0);
                          auVar91._4_4_ = -(uint)((int)((ulong)local_1248 >> 0x20) == 0);
                          auVar91._8_4_ = -(uint)((int)uStack_1240 == 0);
                          auVar91._12_4_ = -(uint)((int)((ulong)uStack_1240 >> 0x20) == 0);
                          auVar116 = auVar91 ^ _DAT_01febe20;
                          if (auVar37 != (undefined1  [16])0x0) {
                            auVar77 = blendvps(*(undefined1 (*) [16])args.hit,
                                               *(undefined1 (*) [16])(args.ray + 0xc0),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0xc0) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                               *(undefined1 (*) [16])(args.ray + 0xd0),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0xd0) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                               *(undefined1 (*) [16])(args.ray + 0xe0),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0xe0) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                               *(undefined1 (*) [16])(args.ray + 0xf0),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0xf0) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                               *(undefined1 (*) [16])(args.ray + 0x100),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0x100) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                               *(undefined1 (*) [16])(args.ray + 0x110),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0x110) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                               *(undefined1 (*) [16])(args.ray + 0x120),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0x120) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                               *(undefined1 (*) [16])(args.ray + 0x130),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0x130) = auVar77;
                            auVar77 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                               *(undefined1 (*) [16])(args.ray + 0x140),auVar91);
                            *(undefined1 (*) [16])(args.ray + 0x140) = auVar77;
                            pRVar46 = args.ray;
                            pRVar50 = (RTCIntersectArguments *)args.hit;
                          }
                        }
                        if ((_DAT_01fecb20 & auVar116) == (undefined1  [16])0x0) {
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar48;
                        }
                        valid.field_0.v[lVar53] = 0.0;
                        fVar64 = *(float *)(ray + k * 4 + 0x80);
                        valid.field_0.i[0] = -(uint)(fVar96 <= fVar64) & valid.field_0.i[0];
                        valid.field_0.i[1] = -(uint)(fVar98 <= fVar64) & valid.field_0.i[1];
                        valid.field_0.i[2] = -(uint)(fVar133 <= fVar64) & valid.field_0.i[2];
                        valid.field_0.i[3] = -(uint)(fVar148 <= fVar64) & valid.field_0.i[3];
                        iVar51 = movmskps((int)pRVar46,(undefined1  [16])valid.field_0);
                        if (iVar51 != 0) {
                          auVar172 = blendvps(_DAT_01feb9f0,auVar39,(undefined1  [16])valid.field_0)
                          ;
                          auVar146._4_4_ = auVar172._0_4_;
                          auVar146._0_4_ = auVar172._4_4_;
                          auVar146._8_4_ = auVar172._12_4_;
                          auVar146._12_4_ = auVar172._8_4_;
                          auVar77 = minps(auVar146,auVar172);
                          auVar117._0_8_ = auVar77._8_8_;
                          auVar117._8_4_ = auVar77._0_4_;
                          auVar117._12_4_ = auVar77._4_4_;
                          auVar77 = minps(auVar117,auVar77);
                          auVar118._0_8_ =
                               CONCAT44(-(uint)(auVar77._4_4_ == auVar172._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar77._0_4_ == auVar172._0_4_) &
                                        valid.field_0.i[0]);
                          auVar118._8_4_ =
                               -(uint)(auVar77._8_4_ == auVar172._8_4_) & valid.field_0.i[2];
                          auVar118._12_4_ =
                               -(uint)(auVar77._12_4_ == auVar172._12_4_) & valid.field_0.i[3];
                          iVar47 = movmskps((int)pRVar50,auVar118);
                          aVar92 = valid.field_0;
                          if (iVar47 != 0) {
                            aVar92.i[2] = auVar118._8_4_;
                            aVar92._0_8_ = auVar118._0_8_;
                            aVar92.i[3] = auVar118._12_4_;
                          }
                          uVar48 = movmskps(iVar47,(undefined1  [16])aVar92);
                          uVar43 = CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar48);
                          lVar53 = 0;
                          if (uVar43 != 0) {
                            for (; (uVar43 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                            }
                          }
                        }
                      } while ((char)iVar51 != '\0');
                    }
                  }
                }
              }
            }
          }
          sVar45 = 0;
          fVar64 = local_1088;
          fVar133 = fStack_1084;
          fVar148 = fStack_1080;
          fVar151 = fStack_107c;
          fVar120 = local_1098;
          fVar154 = fStack_1094;
          fVar179 = fStack_1090;
          fVar180 = fStack_108c;
          fVar66 = local_10a8;
          fVar181 = fStack_10a4;
          fVar132 = fStack_10a0;
          fVar182 = fStack_109c;
          fVar96 = local_10c8;
          fVar147 = fStack_10c4;
          fVar183 = fStack_10c0;
          fVar150 = fStack_10bc;
          auVar77 = local_10e8;
          fVar94 = local_10b8;
          fVar185 = fStack_10b4;
          fVar153 = fStack_10b0;
          fVar192 = fStack_10ac;
          fVar98 = local_10d8;
          fVar195 = fStack_10d4;
          fVar184 = fStack_10d0;
          fVar197 = fStack_10cc;
        }
        else {
          sVar45 = *(size_t *)*(GridSOA **)(uVar43 & 0xfffffffffffffff0);
          (local_1238->super_Precalculations).grid = *(GridSOA **)(uVar43 & 0xfffffffffffffff0);
        }
        uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar172._4_4_ = uVar63;
        auVar172._0_4_ = uVar63;
        auVar172._8_4_ = uVar63;
        auVar172._12_4_ = uVar63;
        if (sVar45 != 0) {
          (pSVar62->ptr).ptr = sVar45;
          pSVar62->dist = 0;
          pSVar62 = pSVar62 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }